

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  RTCRayQueryContext *pRVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  uint uVar77;
  uint uVar78;
  undefined1 (*pauVar79) [32];
  ulong uVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  long lVar84;
  int iVar85;
  ulong uVar86;
  long lVar87;
  float fVar88;
  float fVar120;
  float fVar122;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar89;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar90;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar124;
  undefined1 auVar107 [32];
  float fVar121;
  float fVar123;
  float fVar125;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar95 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar129;
  float fVar155;
  float fVar156;
  vint4 bi;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar130;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar157;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 bi_2;
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar163 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar199;
  float fVar200;
  vint4 ai_1;
  undefined1 auVar179 [16];
  float fVar201;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar202;
  float fVar203;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar204;
  float fVar205;
  float fVar223;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar206 [16];
  float fVar227;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [28];
  float fVar224;
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar232;
  float fVar248;
  float fVar250;
  undefined1 auVar234 [16];
  float fVar233;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar240 [32];
  float fVar249;
  float fVar251;
  float fVar253;
  undefined1 auVar241 [32];
  float fVar257;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar274;
  float fVar277;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar283;
  float fVar286;
  float fVar289;
  undefined1 auVar265 [32];
  float fVar280;
  undefined1 auVar266 [32];
  float fVar275;
  float fVar278;
  float fVar281;
  float fVar284;
  float fVar287;
  float fVar290;
  undefined1 auVar267 [32];
  float fVar276;
  float fVar279;
  float fVar282;
  float fVar285;
  float fVar288;
  float fVar291;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float fVar292;
  float fVar302;
  float fVar303;
  vint4 ai;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar298 [32];
  float fVar305;
  undefined1 auVar299 [32];
  float fVar304;
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar312;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  float fVar326;
  float fVar330;
  float fVar331;
  undefined1 auVar327 [16];
  float fVar333;
  float fVar335;
  float fVar337;
  undefined1 auVar328 [32];
  float fVar332;
  float fVar334;
  float fVar336;
  float fVar338;
  undefined1 auVar329 [32];
  float fVar339;
  float fVar345;
  float fVar346;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar342 [32];
  float fVar347;
  float fVar351;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar352;
  float fVar356;
  float fVar357;
  undefined1 auVar353 [16];
  float fVar362;
  undefined1 auVar354 [32];
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  undefined1 auVar355 [64];
  float fVar363;
  float fVar368;
  float fVar369;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  float fVar370;
  float fVar374;
  undefined1 auVar366 [32];
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar367 [64];
  float fVar375;
  float fVar382;
  float fVar383;
  undefined1 auVar376 [16];
  float fVar385;
  float fVar386;
  float fVar387;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  float fVar384;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [64];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  float local_c00;
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 (*local_978) [16];
  undefined1 (*local_970) [16];
  uint *local_968;
  undefined1 local_960 [8];
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  ulong local_8e0;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined4 uStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  Primitive *local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  RTCHitN local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [16];
  undefined1 auStack_570 [16];
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar11 = prim[1];
  uVar86 = (ulong)(byte)PVar11;
  lVar87 = uVar86 * 0x25;
  fVar129 = *(float *)(prim + lVar87 + 0x12);
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar135 = vsubps_avx(auVar135,*(undefined1 (*) [16])(prim + lVar87 + 6));
  auVar131._0_4_ = fVar129 * auVar135._0_4_;
  auVar131._4_4_ = fVar129 * auVar135._4_4_;
  auVar131._8_4_ = fVar129 * auVar135._8_4_;
  auVar131._12_4_ = fVar129 * auVar135._12_4_;
  auVar293._0_4_ = fVar129 * auVar19._0_4_;
  auVar293._4_4_ = fVar129 * auVar19._4_4_;
  auVar293._8_4_ = fVar129 * auVar19._8_4_;
  auVar293._12_4_ = fVar129 * auVar19._12_4_;
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 6)));
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar235 = vcvtdq2ps_avx(auVar235);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar86 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar31 = vshufps_avx(auVar293,auVar293,0);
  auVar32 = vshufps_avx(auVar293,auVar293,0x55);
  auVar99 = vshufps_avx(auVar293,auVar293,0xaa);
  fVar129 = auVar99._0_4_;
  fVar257 = auVar99._4_4_;
  fVar89 = auVar99._8_4_;
  fVar90 = auVar99._12_4_;
  fVar204 = auVar32._0_4_;
  fVar223 = auVar32._4_4_;
  fVar225 = auVar32._8_4_;
  fVar227 = auVar32._12_4_;
  fVar178 = auVar31._0_4_;
  fVar199 = auVar31._4_4_;
  fVar200 = auVar31._8_4_;
  fVar201 = auVar31._12_4_;
  auVar364._0_4_ = fVar178 * auVar135._0_4_ + fVar204 * auVar19._0_4_ + fVar129 * auVar30._0_4_;
  auVar364._4_4_ = fVar199 * auVar135._4_4_ + fVar223 * auVar19._4_4_ + fVar257 * auVar30._4_4_;
  auVar364._8_4_ = fVar200 * auVar135._8_4_ + fVar225 * auVar19._8_4_ + fVar89 * auVar30._8_4_;
  auVar364._12_4_ = fVar201 * auVar135._12_4_ + fVar227 * auVar19._12_4_ + fVar90 * auVar30._12_4_;
  auVar376._0_4_ = fVar178 * auVar235._0_4_ + fVar204 * auVar136._0_4_ + auVar97._0_4_ * fVar129;
  auVar376._4_4_ = fVar199 * auVar235._4_4_ + fVar223 * auVar136._4_4_ + auVar97._4_4_ * fVar257;
  auVar376._8_4_ = fVar200 * auVar235._8_4_ + fVar225 * auVar136._8_4_ + auVar97._8_4_ * fVar89;
  auVar376._12_4_ = fVar201 * auVar235._12_4_ + fVar227 * auVar136._12_4_ + auVar97._12_4_ * fVar90;
  auVar294._0_4_ = fVar178 * auVar101._0_4_ + fVar204 * auVar164._0_4_ + auVar190._0_4_ * fVar129;
  auVar294._4_4_ = fVar199 * auVar101._4_4_ + fVar223 * auVar164._4_4_ + auVar190._4_4_ * fVar257;
  auVar294._8_4_ = fVar200 * auVar101._8_4_ + fVar225 * auVar164._8_4_ + auVar190._8_4_ * fVar89;
  auVar294._12_4_ = fVar201 * auVar101._12_4_ + fVar227 * auVar164._12_4_ + auVar190._12_4_ * fVar90
  ;
  auVar31 = vshufps_avx(auVar131,auVar131,0);
  auVar32 = vshufps_avx(auVar131,auVar131,0x55);
  auVar99 = vshufps_avx(auVar131,auVar131,0xaa);
  fVar129 = auVar99._0_4_;
  fVar257 = auVar99._4_4_;
  fVar89 = auVar99._8_4_;
  fVar90 = auVar99._12_4_;
  fVar204 = auVar32._0_4_;
  fVar223 = auVar32._4_4_;
  fVar225 = auVar32._8_4_;
  fVar227 = auVar32._12_4_;
  fVar178 = auVar31._0_4_;
  fVar199 = auVar31._4_4_;
  fVar200 = auVar31._8_4_;
  fVar201 = auVar31._12_4_;
  auVar132._0_4_ = fVar178 * auVar135._0_4_ + fVar204 * auVar19._0_4_ + fVar129 * auVar30._0_4_;
  auVar132._4_4_ = fVar199 * auVar135._4_4_ + fVar223 * auVar19._4_4_ + fVar257 * auVar30._4_4_;
  auVar132._8_4_ = fVar200 * auVar135._8_4_ + fVar225 * auVar19._8_4_ + fVar89 * auVar30._8_4_;
  auVar132._12_4_ = fVar201 * auVar135._12_4_ + fVar227 * auVar19._12_4_ + fVar90 * auVar30._12_4_;
  auVar103._0_4_ = fVar178 * auVar235._0_4_ + auVar97._0_4_ * fVar129 + fVar204 * auVar136._0_4_;
  auVar103._4_4_ = fVar199 * auVar235._4_4_ + auVar97._4_4_ * fVar257 + fVar223 * auVar136._4_4_;
  auVar103._8_4_ = fVar200 * auVar235._8_4_ + auVar97._8_4_ * fVar89 + fVar225 * auVar136._8_4_;
  auVar103._12_4_ = fVar201 * auVar235._12_4_ + auVar97._12_4_ * fVar90 + fVar227 * auVar136._12_4_;
  auVar313._8_4_ = 0x7fffffff;
  auVar313._0_8_ = 0x7fffffff7fffffff;
  auVar313._12_4_ = 0x7fffffff;
  auVar135 = vandps_avx(auVar364,auVar313);
  auVar206._8_4_ = 0x219392ef;
  auVar206._0_8_ = 0x219392ef219392ef;
  auVar206._12_4_ = 0x219392ef;
  auVar135 = vcmpps_avx(auVar135,auVar206,1);
  auVar19 = vblendvps_avx(auVar364,auVar206,auVar135);
  auVar135 = vandps_avx(auVar376,auVar313);
  auVar135 = vcmpps_avx(auVar135,auVar206,1);
  auVar30 = vblendvps_avx(auVar376,auVar206,auVar135);
  auVar135 = vandps_avx(auVar313,auVar294);
  auVar135 = vcmpps_avx(auVar135,auVar206,1);
  auVar135 = vblendvps_avx(auVar294,auVar206,auVar135);
  auVar158._0_4_ = fVar178 * auVar101._0_4_ + fVar204 * auVar164._0_4_ + auVar190._0_4_ * fVar129;
  auVar158._4_4_ = fVar199 * auVar101._4_4_ + fVar223 * auVar164._4_4_ + auVar190._4_4_ * fVar257;
  auVar158._8_4_ = fVar200 * auVar101._8_4_ + fVar225 * auVar164._8_4_ + auVar190._8_4_ * fVar89;
  auVar158._12_4_ = fVar201 * auVar101._12_4_ + fVar227 * auVar164._12_4_ + auVar190._12_4_ * fVar90
  ;
  auVar235 = vrcpps_avx(auVar19);
  fVar178 = auVar235._0_4_;
  auVar179._0_4_ = fVar178 * auVar19._0_4_;
  fVar199 = auVar235._4_4_;
  auVar179._4_4_ = fVar199 * auVar19._4_4_;
  fVar200 = auVar235._8_4_;
  auVar179._8_4_ = fVar200 * auVar19._8_4_;
  fVar201 = auVar235._12_4_;
  auVar179._12_4_ = fVar201 * auVar19._12_4_;
  auVar261._8_4_ = 0x3f800000;
  auVar261._0_8_ = 0x3f8000003f800000;
  auVar261._12_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar261,auVar179);
  fVar178 = fVar178 + fVar178 * auVar19._0_4_;
  fVar199 = fVar199 + fVar199 * auVar19._4_4_;
  fVar200 = fVar200 + fVar200 * auVar19._8_4_;
  fVar201 = fVar201 + fVar201 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar30);
  fVar204 = auVar19._0_4_;
  auVar234._0_4_ = fVar204 * auVar30._0_4_;
  fVar223 = auVar19._4_4_;
  auVar234._4_4_ = fVar223 * auVar30._4_4_;
  fVar225 = auVar19._8_4_;
  auVar234._8_4_ = fVar225 * auVar30._8_4_;
  fVar227 = auVar19._12_4_;
  auVar234._12_4_ = fVar227 * auVar30._12_4_;
  auVar19 = vsubps_avx(auVar261,auVar234);
  fVar204 = fVar204 + fVar204 * auVar19._0_4_;
  fVar223 = fVar223 + fVar223 * auVar19._4_4_;
  fVar225 = fVar225 + fVar225 * auVar19._8_4_;
  fVar227 = fVar227 + fVar227 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar135);
  fVar232 = auVar19._0_4_;
  auVar295._0_4_ = fVar232 * auVar135._0_4_;
  fVar248 = auVar19._4_4_;
  auVar295._4_4_ = fVar248 * auVar135._4_4_;
  fVar250 = auVar19._8_4_;
  auVar295._8_4_ = fVar250 * auVar135._8_4_;
  fVar252 = auVar19._12_4_;
  auVar295._12_4_ = fVar252 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar261,auVar295);
  fVar232 = fVar232 + fVar232 * auVar135._0_4_;
  fVar248 = fVar248 + fVar248 * auVar135._4_4_;
  fVar250 = fVar250 + fVar250 * auVar135._8_4_;
  fVar252 = fVar252 + fVar252 * auVar135._12_4_;
  auVar135 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar87 + 0x16)) *
                           *(float *)(prim + lVar87 + 0x1a)));
  auVar30 = vshufps_avx(auVar135,auVar135,0);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar135 = vpmovsxwd_avx(auVar135);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar235 = vsubps_avx(auVar19,auVar135);
  fVar129 = auVar30._0_4_;
  fVar257 = auVar30._4_4_;
  fVar89 = auVar30._8_4_;
  fVar90 = auVar30._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar30);
  auVar296._0_4_ = auVar235._0_4_ * fVar129 + auVar135._0_4_;
  auVar296._4_4_ = auVar235._4_4_ * fVar257 + auVar135._4_4_;
  auVar296._8_4_ = auVar235._8_4_ * fVar89 + auVar135._8_4_;
  auVar296._12_4_ = auVar235._12_4_ * fVar90 + auVar135._12_4_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar30 = vpmovsxwd_avx(auVar235);
  auVar135 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar30);
  auVar19 = vsubps_avx(auVar19,auVar135);
  auVar314._0_4_ = auVar19._0_4_ * fVar129 + auVar135._0_4_;
  auVar314._4_4_ = auVar19._4_4_ * fVar257 + auVar135._4_4_;
  auVar314._8_4_ = auVar19._8_4_ * fVar89 + auVar135._8_4_;
  auVar314._12_4_ = auVar19._12_4_ * fVar90 + auVar135._12_4_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar135 = vpmovsxwd_avx(auVar136);
  uVar80 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar86 * 2 + uVar80 + 6);
  auVar19 = vpmovsxwd_avx(auVar97);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar135);
  auVar327._0_4_ = auVar19._0_4_ * fVar129 + auVar135._0_4_;
  auVar327._4_4_ = auVar19._4_4_ * fVar257 + auVar135._4_4_;
  auVar327._8_4_ = auVar19._8_4_ * fVar89 + auVar135._8_4_;
  auVar327._12_4_ = auVar19._12_4_ * fVar90 + auVar135._12_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar135 = vpmovsxwd_avx(auVar101);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 6);
  auVar19 = vpmovsxwd_avx(auVar164);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar30 = vsubps_avx(auVar19,auVar135);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 6);
  auVar19 = vpmovsxwd_avx(auVar190);
  auVar340._0_4_ = auVar30._0_4_ * fVar129 + auVar135._0_4_;
  auVar340._4_4_ = auVar30._4_4_ * fVar257 + auVar135._4_4_;
  auVar340._8_4_ = auVar30._8_4_ * fVar89 + auVar135._8_4_;
  auVar340._12_4_ = auVar30._12_4_ * fVar90 + auVar135._12_4_;
  auVar135 = vcvtdq2ps_avx(auVar19);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar86 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar19 = vpmovsxwd_avx(auVar31);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar135);
  auVar353._0_4_ = auVar19._0_4_ * fVar129 + auVar135._0_4_;
  auVar353._4_4_ = auVar19._4_4_ * fVar257 + auVar135._4_4_;
  auVar353._8_4_ = auVar19._8_4_ * fVar89 + auVar135._8_4_;
  auVar353._12_4_ = auVar19._12_4_ * fVar90 + auVar135._12_4_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar86) + 6);
  auVar135 = vpmovsxwd_avx(auVar32);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 6);
  auVar19 = vpmovsxwd_avx(auVar99);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar135);
  auVar262._0_4_ = auVar135._0_4_ + auVar19._0_4_ * fVar129;
  auVar262._4_4_ = auVar135._4_4_ + auVar19._4_4_ * fVar257;
  auVar262._8_4_ = auVar135._8_4_ + auVar19._8_4_ * fVar89;
  auVar262._12_4_ = auVar135._12_4_ + auVar19._12_4_ * fVar90;
  auVar135 = vsubps_avx(auVar296,auVar132);
  auVar297._0_4_ = fVar178 * auVar135._0_4_;
  auVar297._4_4_ = fVar199 * auVar135._4_4_;
  auVar297._8_4_ = fVar200 * auVar135._8_4_;
  auVar297._12_4_ = fVar201 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar314,auVar132);
  auVar133._0_4_ = fVar178 * auVar135._0_4_;
  auVar133._4_4_ = fVar199 * auVar135._4_4_;
  auVar133._8_4_ = fVar200 * auVar135._8_4_;
  auVar133._12_4_ = fVar201 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar327,auVar103);
  auVar180._0_4_ = fVar204 * auVar135._0_4_;
  auVar180._4_4_ = fVar223 * auVar135._4_4_;
  auVar180._8_4_ = fVar225 * auVar135._8_4_;
  auVar180._12_4_ = fVar227 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar340,auVar103);
  auVar91._0_4_ = fVar204 * auVar135._0_4_;
  auVar91._4_4_ = fVar223 * auVar135._4_4_;
  auVar91._8_4_ = fVar225 * auVar135._8_4_;
  auVar91._12_4_ = fVar227 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar353,auVar158);
  auVar207._0_4_ = fVar232 * auVar135._0_4_;
  auVar207._4_4_ = fVar248 * auVar135._4_4_;
  auVar207._8_4_ = fVar250 * auVar135._8_4_;
  auVar207._12_4_ = fVar252 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar262,auVar158);
  auVar159._0_4_ = fVar232 * auVar135._0_4_;
  auVar159._4_4_ = fVar248 * auVar135._4_4_;
  auVar159._8_4_ = fVar250 * auVar135._8_4_;
  auVar159._12_4_ = fVar252 * auVar135._12_4_;
  auVar135 = vpminsd_avx(auVar297,auVar133);
  auVar19 = vpminsd_avx(auVar180,auVar91);
  auVar135 = vmaxps_avx(auVar135,auVar19);
  auVar19 = vpminsd_avx(auVar207,auVar159);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar315._4_4_ = uVar9;
  auVar315._0_4_ = uVar9;
  auVar315._8_4_ = uVar9;
  auVar315._12_4_ = uVar9;
  auVar19 = vmaxps_avx(auVar19,auVar315);
  auVar135 = vmaxps_avx(auVar135,auVar19);
  local_5e0._0_4_ = auVar135._0_4_ * 0.99999964;
  local_5e0._4_4_ = auVar135._4_4_ * 0.99999964;
  local_5e0._8_4_ = auVar135._8_4_ * 0.99999964;
  local_5e0._12_4_ = auVar135._12_4_ * 0.99999964;
  auVar135 = vpmaxsd_avx(auVar297,auVar133);
  auVar19 = vpmaxsd_avx(auVar180,auVar91);
  auVar135 = vminps_avx(auVar135,auVar19);
  auVar19 = vpmaxsd_avx(auVar207,auVar159);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar160._4_4_ = uVar9;
  auVar160._0_4_ = uVar9;
  auVar160._8_4_ = uVar9;
  auVar160._12_4_ = uVar9;
  auVar19 = vminps_avx(auVar19,auVar160);
  auVar135 = vminps_avx(auVar135,auVar19);
  auVar92._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar92._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar92._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar92._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar135 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar19 = vpcmpgtd_avx(auVar135,_DAT_01f7fcf0);
  auVar135 = vcmpps_avx(local_5e0,auVar92,2);
  auVar135 = vandps_avx(auVar135,auVar19);
  uVar77 = vmovmskps_avx(auVar135);
  if (uVar77 == 0) {
    return;
  }
  uVar77 = uVar77 & 0xff;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  local_968 = &local_4e0;
  uVar83 = 1 << ((byte)k & 0x1f);
  local_970 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar83 & 0xf) << 4));
  local_978 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar83 >> 4) * 0x10);
  local_868 = prim;
LAB_00f6b522:
  lVar87 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
    }
  }
  uVar83 = *(uint *)(local_868 + 2);
  local_8e0 = (ulong)*(uint *)(local_868 + lVar87 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar83].ptr;
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_8e0 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar129 = (pGVar12->time_range).lower;
  fVar129 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar129) / ((pGVar12->time_range).upper - fVar129));
  auVar135 = vroundss_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),9);
  auVar135 = vminss_avx(auVar135,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar135 = vmaxss_avx(ZEXT816(0) << 0x20,auVar135);
  fVar129 = fVar129 - auVar135._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar84 = (long)(int)auVar135._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + 0x10 + lVar84);
  lVar15 = *(long *)(_Var13 + 0x38 + lVar84);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar84);
  auVar135 = vshufps_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),0);
  pfVar2 = (float *)(lVar15 + lVar16 * uVar86);
  fVar201 = auVar135._0_4_;
  fVar204 = auVar135._4_4_;
  fVar223 = auVar135._8_4_;
  fVar225 = auVar135._12_4_;
  lVar1 = uVar86 + 1;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  p_Var17 = pGVar12[4].occlusionFilterN;
  auVar135 = vshufps_avx(ZEXT416((uint)(1.0 - fVar129)),ZEXT416((uint)(1.0 - fVar129)),0);
  pfVar4 = (float *)(*(long *)(_Var13 + lVar84) + lVar14 * uVar86);
  fVar90 = auVar135._0_4_;
  fVar178 = auVar135._4_4_;
  fVar199 = auVar135._8_4_;
  fVar200 = auVar135._12_4_;
  pfVar5 = (float *)(*(long *)(_Var13 + lVar84) + lVar14 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var17 + lVar84 + 0x38) +
                    uVar86 * *(long *)(p_Var17 + lVar84 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var17 + lVar84 + 0x38) + *(long *)(p_Var17 + lVar84 + 0x48) * lVar1
                    );
  pfVar8 = (float *)(*(long *)(p_Var17 + lVar84) + *(long *)(p_Var17 + lVar84 + 0x10) * uVar86);
  auVar134._0_4_ = fVar90 * *pfVar4 + fVar201 * *pfVar2;
  auVar134._4_4_ = fVar178 * pfVar4[1] + fVar204 * pfVar2[1];
  auVar134._8_4_ = fVar199 * pfVar4[2] + fVar223 * pfVar2[2];
  auVar134._12_4_ = fVar200 * pfVar4[3] + fVar225 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var17 + lVar84) + *(long *)(p_Var17 + lVar84 + 0x10) * lVar1);
  auVar161._0_4_ = fVar90 * *pfVar5 + fVar201 * *pfVar3;
  auVar161._4_4_ = fVar178 * pfVar5[1] + fVar204 * pfVar3[1];
  auVar161._8_4_ = fVar199 * pfVar5[2] + fVar223 * pfVar3[2];
  auVar161._12_4_ = fVar200 * pfVar5[3] + fVar225 * pfVar3[3];
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar19 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar129 = *(float *)(ray + k * 4 + 0x80);
  auVar341._4_4_ = fVar129;
  auVar341._0_4_ = fVar129;
  auVar341._8_4_ = fVar129;
  auVar341._12_4_ = fVar129;
  fStack_7f0 = fVar129;
  _local_800 = auVar341;
  fStack_7ec = fVar129;
  fStack_7e8 = fVar129;
  fStack_7e4 = fVar129;
  fVar257 = *(float *)(ray + k * 4 + 0xa0);
  auVar365._4_4_ = fVar257;
  auVar365._0_4_ = fVar257;
  auVar365._8_4_ = fVar257;
  auVar365._12_4_ = fVar257;
  fStack_810 = fVar257;
  _local_820 = auVar365;
  fStack_80c = fVar257;
  fStack_808 = fVar257;
  fStack_804 = fVar257;
  auVar135 = vunpcklps_avx(auVar341,auVar365);
  fVar89 = *(float *)(ray + k * 4 + 0xc0);
  auVar388._4_4_ = fVar89;
  auVar388._0_4_ = fVar89;
  auVar388._8_4_ = fVar89;
  auVar388._12_4_ = fVar89;
  fStack_7b0 = fVar89;
  _local_7c0 = auVar388;
  fStack_7ac = fVar89;
  fStack_7a8 = fVar89;
  fStack_7a4 = fVar89;
  _local_910 = vinsertps_avx(auVar135,auVar388,0x28);
  auVar208._0_4_ = auVar134._0_4_ + (fVar90 * *pfVar8 + fVar201 * *pfVar6) * 0.33333334;
  auVar208._4_4_ = auVar134._4_4_ + (fVar178 * pfVar8[1] + fVar204 * pfVar6[1]) * 0.33333334;
  auVar208._8_4_ = auVar134._8_4_ + (fVar199 * pfVar8[2] + fVar223 * pfVar6[2]) * 0.33333334;
  auVar208._12_4_ = auVar134._12_4_ + (fVar200 * pfVar8[3] + fVar225 * pfVar6[3]) * 0.33333334;
  auVar93._0_4_ = (fVar90 * *pfVar2 + fVar201 * *pfVar7) * 0.33333334;
  auVar93._4_4_ = (fVar178 * pfVar2[1] + fVar204 * pfVar7[1]) * 0.33333334;
  auVar93._8_4_ = (fVar199 * pfVar2[2] + fVar223 * pfVar7[2]) * 0.33333334;
  auVar93._12_4_ = (fVar200 * pfVar2[3] + fVar225 * pfVar7[3]) * 0.33333334;
  auVar235 = vsubps_avx(auVar161,auVar93);
  auVar94._0_4_ = (auVar161._0_4_ + auVar134._0_4_ + auVar208._0_4_ + auVar235._0_4_) * 0.25;
  auVar94._4_4_ = (auVar161._4_4_ + auVar134._4_4_ + auVar208._4_4_ + auVar235._4_4_) * 0.25;
  auVar94._8_4_ = (auVar161._8_4_ + auVar134._8_4_ + auVar208._8_4_ + auVar235._8_4_) * 0.25;
  auVar94._12_4_ = (auVar161._12_4_ + auVar134._12_4_ + auVar208._12_4_ + auVar235._12_4_) * 0.25;
  auVar135 = vsubps_avx(auVar94,auVar19);
  auVar135 = vdpps_avx(auVar135,_local_910,0x7f);
  local_920 = vdpps_avx(_local_910,_local_910,0x7f);
  auVar30 = vrcpss_avx(local_920,local_920);
  fVar90 = auVar135._0_4_ * auVar30._0_4_ * (2.0 - local_920._0_4_ * auVar30._0_4_);
  auVar30 = vshufps_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90),0);
  auVar181._0_4_ = auVar19._0_4_ + local_910._0_4_ * auVar30._0_4_;
  auVar181._4_4_ = auVar19._4_4_ + local_910._4_4_ * auVar30._4_4_;
  auVar181._8_4_ = auVar19._8_4_ + local_910._8_4_ * auVar30._8_4_;
  auVar181._12_4_ = auVar19._12_4_ + local_910._12_4_ * auVar30._12_4_;
  auVar135 = vblendps_avx(auVar181,_DAT_01f7aa10,8);
  _local_ae0 = vsubps_avx(auVar134,auVar135);
  _local_af0 = vsubps_avx(auVar235,auVar135);
  _local_b00 = vsubps_avx(auVar208,auVar135);
  _local_b10 = vsubps_avx(auVar161,auVar135);
  auVar19 = vshufps_avx(_local_ae0,_local_ae0,0);
  auVar135 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  local_9a0._16_16_ = auVar135;
  local_9a0._0_16_ = auVar135;
  auVar325 = ZEXT3264(local_9a0);
  auVar135 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  local_9c0._16_16_ = auVar135;
  local_9c0._0_16_ = auVar135;
  auVar355 = ZEXT3264(local_9c0);
  auVar135 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  local_9e0._16_16_ = auVar135;
  local_9e0._0_16_ = auVar135;
  auVar367 = ZEXT3264(local_9e0);
  auVar135 = vshufps_avx(_local_b00,_local_b00,0);
  auVar265._16_16_ = auVar135;
  auVar265._0_16_ = auVar135;
  auVar135 = vshufps_avx(_local_b00,_local_b00,0x55);
  local_a00._16_16_ = auVar135;
  local_a00._0_16_ = auVar135;
  auVar396 = ZEXT3264(local_a00);
  auVar135 = vshufps_avx(_local_b00,_local_b00,0xaa);
  local_a20._16_16_ = auVar135;
  local_a20._0_16_ = auVar135;
  auVar400 = ZEXT3264(local_a20);
  auVar135 = vshufps_avx(_local_b00,_local_b00,0xff);
  local_a60._16_16_ = auVar135;
  local_a60._0_16_ = auVar135;
  auVar273 = ZEXT3264(local_a60);
  auVar135 = vshufps_avx(_local_af0,_local_af0,0);
  local_2c0._16_16_ = auVar135;
  local_2c0._0_16_ = auVar135;
  auVar135 = vshufps_avx(_local_af0,_local_af0,0x55);
  local_2e0._16_16_ = auVar135;
  local_2e0._0_16_ = auVar135;
  auVar135 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar135;
  _local_1e0 = auVar135;
  auVar135 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar135;
  _local_200 = auVar135;
  auVar135 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar135;
  _local_220 = auVar135;
  auVar135 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar135;
  _local_240 = auVar135;
  auVar135 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar135;
  _local_260 = auVar135;
  auVar135 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar135;
  _local_280 = auVar135;
  auVar135 = ZEXT416((uint)(fVar129 * fVar129 + fVar257 * fVar257 + fVar89 * fVar89));
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  local_2a0._16_16_ = auVar135;
  local_2a0._0_16_ = auVar135;
  fVar129 = *(float *)(ray + k * 4 + 0x60);
  local_880 = ZEXT416((uint)fVar90);
  auVar135 = vshufps_avx(ZEXT416((uint)(fVar129 - fVar90)),ZEXT416((uint)(fVar129 - fVar90)),0);
  local_300._16_16_ = auVar135;
  local_300._0_16_ = auVar135;
  auVar135 = vpshufd_avx(ZEXT416(uVar83),0);
  local_460._16_16_ = auVar135;
  local_460._0_16_ = auVar135;
  auVar135 = vpshufd_avx(ZEXT416(*(uint *)(local_868 + lVar87 * 4 + 6)),0);
  local_480._16_16_ = auVar135;
  local_480._0_16_ = auVar135;
  local_c80 = auVar30._0_8_;
  uStack_c78 = auVar30._8_8_;
  local_8c0 = local_c80;
  uStack_8b8 = uStack_c78;
  uStack_8b0 = local_c80;
  uStack_8a8 = uStack_c78;
  uVar86 = 0;
  local_c88 = 1;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_2a0,auVar106);
  auVar135 = vsqrtss_avx(local_920,local_920);
  auVar30 = vsqrtss_avx(local_920,local_920);
  local_5d0 = ZEXT816(0x3f80000000000000);
  local_420 = auVar265;
  do {
    auVar240._8_4_ = 0x3f800000;
    auVar240._0_8_ = 0x3f8000003f800000;
    auVar240._12_4_ = 0x3f800000;
    auVar240._16_4_ = 0x3f800000;
    auVar240._20_4_ = 0x3f800000;
    iVar85 = (int)uVar86;
    auVar240._24_4_ = 0x3f800000;
    auVar240._28_4_ = 0x3f800000;
    auVar235 = vmovshdup_avx(local_5d0);
    auVar97 = vsubps_avx(auVar235,local_5d0);
    auVar235 = vshufps_avx(local_5d0,local_5d0,0);
    local_760._16_16_ = auVar235;
    local_760._0_16_ = auVar235;
    auVar136 = vshufps_avx(auVar97,auVar97,0);
    local_780._16_16_ = auVar136;
    local_780._0_16_ = auVar136;
    fVar130 = auVar136._0_4_;
    fVar155 = auVar136._4_4_;
    fVar156 = auVar136._8_4_;
    fVar157 = auVar136._12_4_;
    fVar88 = auVar235._0_4_;
    auVar147._0_4_ = fVar88 + fVar130 * 0.0;
    fVar120 = auVar235._4_4_;
    auVar147._4_4_ = fVar120 + fVar155 * 0.14285715;
    fVar122 = auVar235._8_4_;
    auVar147._8_4_ = fVar122 + fVar156 * 0.2857143;
    fVar124 = auVar235._12_4_;
    auVar147._12_4_ = fVar124 + fVar157 * 0.42857146;
    auVar147._16_4_ = fVar88 + fVar130 * 0.5714286;
    auVar147._20_4_ = fVar120 + fVar155 * 0.71428573;
    auVar147._24_4_ = fVar122 + fVar156 * 0.8571429;
    auVar147._28_4_ = fVar124 + fVar157;
    auVar105 = vsubps_avx(auVar240,auVar147);
    fVar204 = auVar265._28_4_;
    fVar257 = auVar105._0_4_;
    fVar89 = auVar105._4_4_;
    fVar90 = auVar105._8_4_;
    fVar178 = auVar105._12_4_;
    fVar199 = auVar105._16_4_;
    fVar200 = auVar105._20_4_;
    fVar201 = auVar105._24_4_;
    fVar203 = auVar273._28_4_ + fVar204 + auVar19._12_4_ + 1.0 + 1.0;
    fVar258 = local_2c0._0_4_ * auVar147._0_4_ + auVar265._0_4_ * fVar257;
    fVar274 = local_2c0._4_4_ * auVar147._4_4_ + auVar265._4_4_ * fVar89;
    fVar277 = local_2c0._8_4_ * auVar147._8_4_ + auVar265._8_4_ * fVar90;
    fVar280 = local_2c0._12_4_ * auVar147._12_4_ + auVar265._12_4_ * fVar178;
    fVar283 = local_2c0._16_4_ * auVar147._16_4_ + auVar265._16_4_ * fVar199;
    fVar286 = local_2c0._20_4_ * auVar147._20_4_ + auVar265._20_4_ * fVar200;
    fVar289 = local_2c0._24_4_ * auVar147._24_4_ + auVar265._24_4_ * fVar201;
    fVar225 = local_2e0._0_4_ * auVar147._0_4_ + auVar396._0_4_ * fVar257;
    fVar227 = local_2e0._4_4_ * auVar147._4_4_ + auVar396._4_4_ * fVar89;
    fVar232 = local_2e0._8_4_ * auVar147._8_4_ + auVar396._8_4_ * fVar90;
    fVar248 = local_2e0._12_4_ * auVar147._12_4_ + auVar396._12_4_ * fVar178;
    fVar250 = local_2e0._16_4_ * auVar147._16_4_ + auVar396._16_4_ * fVar199;
    fVar252 = local_2e0._20_4_ * auVar147._20_4_ + auVar396._20_4_ * fVar200;
    fVar202 = local_2e0._24_4_ * auVar147._24_4_ + auVar396._24_4_ * fVar201;
    fVar205 = (float)local_1e0._0_4_ * auVar147._0_4_ + auVar400._0_4_ * fVar257;
    fVar224 = (float)local_1e0._4_4_ * auVar147._4_4_ + auVar400._4_4_ * fVar89;
    fVar226 = fStack_1d8 * auVar147._8_4_ + auVar400._8_4_ * fVar90;
    fVar228 = fStack_1d4 * auVar147._12_4_ + auVar400._12_4_ * fVar178;
    fVar229 = fStack_1d0 * auVar147._16_4_ + auVar400._16_4_ * fVar199;
    fVar230 = fStack_1cc * auVar147._20_4_ + auVar400._20_4_ * fVar200;
    fVar231 = fStack_1c8 * auVar147._24_4_ + auVar400._24_4_ * fVar201;
    fVar233 = (float)local_200._0_4_ * auVar147._0_4_ + auVar273._0_4_ * fVar257;
    fVar249 = (float)local_200._4_4_ * auVar147._4_4_ + auVar273._4_4_ * fVar89;
    fVar251 = fStack_1f8 * auVar147._8_4_ + auVar273._8_4_ * fVar90;
    fVar253 = fStack_1f4 * auVar147._12_4_ + auVar273._12_4_ * fVar178;
    fVar254 = fStack_1f0 * auVar147._16_4_ + auVar273._16_4_ * fVar199;
    fVar255 = fStack_1ec * auVar147._20_4_ + auVar273._20_4_ * fVar200;
    fVar256 = fStack_1e8 * auVar147._24_4_ + auVar273._24_4_ * fVar201;
    fVar362 = auVar355._28_4_;
    fVar374 = auVar367._28_4_ + fVar362;
    auVar328._0_4_ =
         fVar257 * (auVar265._0_4_ * auVar147._0_4_ + auVar19._0_4_ * fVar257) +
         auVar147._0_4_ * fVar258;
    auVar328._4_4_ =
         fVar89 * (auVar265._4_4_ * auVar147._4_4_ + auVar19._4_4_ * fVar89) +
         auVar147._4_4_ * fVar274;
    auVar328._8_4_ =
         fVar90 * (auVar265._8_4_ * auVar147._8_4_ + auVar19._8_4_ * fVar90) +
         auVar147._8_4_ * fVar277;
    auVar328._12_4_ =
         fVar178 * (auVar265._12_4_ * auVar147._12_4_ + auVar19._12_4_ * fVar178) +
         auVar147._12_4_ * fVar280;
    auVar328._16_4_ =
         fVar199 * (auVar265._16_4_ * auVar147._16_4_ + auVar19._0_4_ * fVar199) +
         auVar147._16_4_ * fVar283;
    auVar328._20_4_ =
         fVar200 * (auVar265._20_4_ * auVar147._20_4_ + auVar19._4_4_ * fVar200) +
         auVar147._20_4_ * fVar286;
    auVar328._24_4_ =
         fVar201 * (auVar265._24_4_ * auVar147._24_4_ + auVar19._8_4_ * fVar201) +
         auVar147._24_4_ * fVar289;
    auVar328._28_4_ = local_2e0._28_4_ + fVar362;
    auVar342._0_4_ =
         fVar257 * (auVar396._0_4_ * auVar147._0_4_ + auVar325._0_4_ * fVar257) +
         auVar147._0_4_ * fVar225;
    auVar342._4_4_ =
         fVar89 * (auVar396._4_4_ * auVar147._4_4_ + auVar325._4_4_ * fVar89) +
         auVar147._4_4_ * fVar227;
    auVar342._8_4_ =
         fVar90 * (auVar396._8_4_ * auVar147._8_4_ + auVar325._8_4_ * fVar90) +
         auVar147._8_4_ * fVar232;
    auVar342._12_4_ =
         fVar178 * (auVar396._12_4_ * auVar147._12_4_ + auVar325._12_4_ * fVar178) +
         auVar147._12_4_ * fVar248;
    auVar342._16_4_ =
         fVar199 * (auVar396._16_4_ * auVar147._16_4_ + auVar325._16_4_ * fVar199) +
         auVar147._16_4_ * fVar250;
    auVar342._20_4_ =
         fVar200 * (auVar396._20_4_ * auVar147._20_4_ + auVar325._20_4_ * fVar200) +
         auVar147._20_4_ * fVar252;
    auVar342._24_4_ =
         fVar201 * (auVar396._24_4_ * auVar147._24_4_ + auVar325._24_4_ * fVar201) +
         auVar147._24_4_ * fVar202;
    auVar342._28_4_ = fStack_1c4 + fVar362;
    fVar223 = local_2c0._28_4_;
    auVar354._0_4_ =
         fVar257 * (auVar400._0_4_ * auVar147._0_4_ + auVar355._0_4_ * fVar257) +
         auVar147._0_4_ * fVar205;
    auVar354._4_4_ =
         fVar89 * (auVar400._4_4_ * auVar147._4_4_ + auVar355._4_4_ * fVar89) +
         auVar147._4_4_ * fVar224;
    auVar354._8_4_ =
         fVar90 * (auVar400._8_4_ * auVar147._8_4_ + auVar355._8_4_ * fVar90) +
         auVar147._8_4_ * fVar226;
    auVar354._12_4_ =
         fVar178 * (auVar400._12_4_ * auVar147._12_4_ + auVar355._12_4_ * fVar178) +
         auVar147._12_4_ * fVar228;
    auVar354._16_4_ =
         fVar199 * (auVar400._16_4_ * auVar147._16_4_ + auVar355._16_4_ * fVar199) +
         auVar147._16_4_ * fVar229;
    auVar354._20_4_ =
         fVar200 * (auVar400._20_4_ * auVar147._20_4_ + auVar355._20_4_ * fVar200) +
         auVar147._20_4_ * fVar230;
    auVar354._24_4_ =
         fVar201 * (auVar400._24_4_ * auVar147._24_4_ + auVar355._24_4_ * fVar201) +
         auVar147._24_4_ * fVar231;
    auVar354._28_4_ = fVar223 + fVar362;
    auVar298._0_4_ =
         auVar147._0_4_ * fVar233 +
         fVar257 * (auVar273._0_4_ * auVar147._0_4_ + auVar367._0_4_ * fVar257);
    auVar298._4_4_ =
         auVar147._4_4_ * fVar249 +
         fVar89 * (auVar273._4_4_ * auVar147._4_4_ + auVar367._4_4_ * fVar89);
    auVar298._8_4_ =
         auVar147._8_4_ * fVar251 +
         fVar90 * (auVar273._8_4_ * auVar147._8_4_ + auVar367._8_4_ * fVar90);
    auVar298._12_4_ =
         auVar147._12_4_ * fVar253 +
         fVar178 * (auVar273._12_4_ * auVar147._12_4_ + auVar367._12_4_ * fVar178);
    auVar298._16_4_ =
         auVar147._16_4_ * fVar254 +
         fVar199 * (auVar273._16_4_ * auVar147._16_4_ + auVar367._16_4_ * fVar199);
    auVar298._20_4_ =
         auVar147._20_4_ * fVar255 +
         fVar200 * (auVar273._20_4_ * auVar147._20_4_ + auVar367._20_4_ * fVar200);
    auVar298._24_4_ =
         auVar147._24_4_ * fVar256 +
         fVar201 * (auVar273._24_4_ * auVar147._24_4_ + auVar367._24_4_ * fVar201);
    auVar298._28_4_ = fVar223 + fStack_1e4;
    auVar266._0_4_ =
         (auVar147._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar257) * auVar147._0_4_ +
         fVar257 * fVar258;
    auVar266._4_4_ =
         (auVar147._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar89) * auVar147._4_4_ +
         fVar89 * fVar274;
    auVar266._8_4_ =
         (auVar147._8_4_ * fStack_218 + local_2c0._8_4_ * fVar90) * auVar147._8_4_ +
         fVar90 * fVar277;
    auVar266._12_4_ =
         (auVar147._12_4_ * fStack_214 + local_2c0._12_4_ * fVar178) * auVar147._12_4_ +
         fVar178 * fVar280;
    auVar266._16_4_ =
         (auVar147._16_4_ * fStack_210 + local_2c0._16_4_ * fVar199) * auVar147._16_4_ +
         fVar199 * fVar283;
    auVar266._20_4_ =
         (auVar147._20_4_ * fStack_20c + local_2c0._20_4_ * fVar200) * auVar147._20_4_ +
         fVar200 * fVar286;
    auVar266._24_4_ =
         (auVar147._24_4_ * fStack_208 + local_2c0._24_4_ * fVar201) * auVar147._24_4_ +
         fVar201 * fVar289;
    auVar266._28_4_ = fVar223 + fVar203 + auVar273._28_4_;
    auVar195._0_4_ =
         (auVar147._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar257) * auVar147._0_4_ +
         fVar257 * fVar225;
    auVar195._4_4_ =
         (auVar147._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar89) * auVar147._4_4_ +
         fVar89 * fVar227;
    auVar195._8_4_ =
         (auVar147._8_4_ * fStack_238 + local_2e0._8_4_ * fVar90) * auVar147._8_4_ +
         fVar90 * fVar232;
    auVar195._12_4_ =
         (auVar147._12_4_ * fStack_234 + local_2e0._12_4_ * fVar178) * auVar147._12_4_ +
         fVar178 * fVar248;
    auVar195._16_4_ =
         (auVar147._16_4_ * fStack_230 + local_2e0._16_4_ * fVar199) * auVar147._16_4_ +
         fVar199 * fVar250;
    auVar195._20_4_ =
         (auVar147._20_4_ * fStack_22c + local_2e0._20_4_ * fVar200) * auVar147._20_4_ +
         fVar200 * fVar252;
    auVar195._24_4_ =
         (auVar147._24_4_ * fStack_228 + local_2e0._24_4_ * fVar201) * auVar147._24_4_ +
         fVar201 * fVar202;
    auVar195._28_4_ = fVar223 + fVar204 + fVar203;
    auVar218._0_4_ =
         (auVar147._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar257) *
         auVar147._0_4_ + fVar257 * fVar205;
    auVar218._4_4_ =
         (auVar147._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar89) *
         auVar147._4_4_ + fVar89 * fVar224;
    auVar218._8_4_ =
         (auVar147._8_4_ * fStack_258 + fStack_1d8 * fVar90) * auVar147._8_4_ + fVar90 * fVar226;
    auVar218._12_4_ =
         (auVar147._12_4_ * fStack_254 + fStack_1d4 * fVar178) * auVar147._12_4_ + fVar178 * fVar228
    ;
    auVar218._16_4_ =
         (auVar147._16_4_ * fStack_250 + fStack_1d0 * fVar199) * auVar147._16_4_ + fVar199 * fVar229
    ;
    auVar218._20_4_ =
         (auVar147._20_4_ * fStack_24c + fStack_1cc * fVar200) * auVar147._20_4_ + fVar200 * fVar230
    ;
    auVar218._24_4_ =
         (auVar147._24_4_ * fStack_248 + fStack_1c8 * fVar201) * auVar147._24_4_ + fVar201 * fVar231
    ;
    auVar218._28_4_ = fVar374 + fVar204 + 1.0;
    auVar241._0_4_ =
         (auVar147._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar257) *
         auVar147._0_4_ + fVar257 * fVar233;
    auVar241._4_4_ =
         (auVar147._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar89) *
         auVar147._4_4_ + fVar89 * fVar249;
    auVar241._8_4_ =
         (auVar147._8_4_ * fStack_278 + fStack_1f8 * fVar90) * auVar147._8_4_ + fVar90 * fVar251;
    auVar241._12_4_ =
         (auVar147._12_4_ * fStack_274 + fStack_1f4 * fVar178) * auVar147._12_4_ + fVar178 * fVar253
    ;
    auVar241._16_4_ =
         (auVar147._16_4_ * fStack_270 + fStack_1f0 * fVar199) * auVar147._16_4_ + fVar199 * fVar254
    ;
    auVar241._20_4_ =
         (auVar147._20_4_ * fStack_26c + fStack_1ec * fVar200) * auVar147._20_4_ + fVar200 * fVar255
    ;
    auVar241._24_4_ =
         (auVar147._24_4_ * fStack_268 + fStack_1e8 * fVar201) * auVar147._24_4_ + fVar201 * fVar256
    ;
    auVar241._28_4_ = fVar362 + fVar204 + fVar362 + 1.0;
    auVar377._0_4_ = auVar328._0_4_ * fVar257 + auVar147._0_4_ * auVar266._0_4_;
    auVar377._4_4_ = auVar328._4_4_ * fVar89 + auVar147._4_4_ * auVar266._4_4_;
    auVar377._8_4_ = auVar328._8_4_ * fVar90 + auVar147._8_4_ * auVar266._8_4_;
    auVar377._12_4_ = auVar328._12_4_ * fVar178 + auVar147._12_4_ * auVar266._12_4_;
    auVar377._16_4_ = auVar328._16_4_ * fVar199 + auVar147._16_4_ * auVar266._16_4_;
    auVar377._20_4_ = auVar328._20_4_ * fVar200 + auVar147._20_4_ * auVar266._20_4_;
    auVar377._24_4_ = auVar328._24_4_ * fVar201 + auVar147._24_4_ * auVar266._24_4_;
    auVar377._28_4_ = fVar362 + fVar204 + fVar223;
    auVar389._0_4_ = auVar342._0_4_ * fVar257 + auVar147._0_4_ * auVar195._0_4_;
    auVar389._4_4_ = auVar342._4_4_ * fVar89 + auVar147._4_4_ * auVar195._4_4_;
    auVar389._8_4_ = auVar342._8_4_ * fVar90 + auVar147._8_4_ * auVar195._8_4_;
    auVar389._12_4_ = auVar342._12_4_ * fVar178 + auVar147._12_4_ * auVar195._12_4_;
    auVar389._16_4_ = auVar342._16_4_ * fVar199 + auVar147._16_4_ * auVar195._16_4_;
    auVar389._20_4_ = auVar342._20_4_ * fVar200 + auVar147._20_4_ * auVar195._20_4_;
    auVar389._24_4_ = auVar342._24_4_ * fVar201 + auVar147._24_4_ * auVar195._24_4_;
    auVar389._28_4_ = fVar223 + fVar374;
    auVar397._0_4_ = auVar354._0_4_ * fVar257 + auVar147._0_4_ * auVar218._0_4_;
    auVar397._4_4_ = auVar354._4_4_ * fVar89 + auVar147._4_4_ * auVar218._4_4_;
    auVar397._8_4_ = auVar354._8_4_ * fVar90 + auVar147._8_4_ * auVar218._8_4_;
    auVar397._12_4_ = auVar354._12_4_ * fVar178 + auVar147._12_4_ * auVar218._12_4_;
    auVar397._16_4_ = auVar354._16_4_ * fVar199 + auVar147._16_4_ * auVar218._16_4_;
    auVar397._20_4_ = auVar354._20_4_ * fVar200 + auVar147._20_4_ * auVar218._20_4_;
    auVar397._24_4_ = auVar354._24_4_ * fVar201 + auVar147._24_4_ * auVar218._24_4_;
    auVar397._28_4_ = fVar374 + fVar223;
    local_c00 = auVar97._0_4_;
    local_7a0._0_4_ = fVar257 * auVar298._0_4_ + auVar147._0_4_ * auVar241._0_4_;
    local_7a0._4_4_ = fVar89 * auVar298._4_4_ + auVar147._4_4_ * auVar241._4_4_;
    local_7a0._8_4_ = fVar90 * auVar298._8_4_ + auVar147._8_4_ * auVar241._8_4_;
    local_7a0._12_4_ = fVar178 * auVar298._12_4_ + auVar147._12_4_ * auVar241._12_4_;
    local_7a0._16_4_ = fVar199 * auVar298._16_4_ + auVar147._16_4_ * auVar241._16_4_;
    local_7a0._20_4_ = fVar200 * auVar298._20_4_ + auVar147._20_4_ * auVar241._20_4_;
    local_7a0._24_4_ = fVar201 * auVar298._24_4_ + auVar147._24_4_ * auVar241._24_4_;
    local_7a0._28_4_ = auVar105._28_4_ + auVar147._28_4_;
    auVar105 = vsubps_avx(auVar266,auVar328);
    auVar265 = vsubps_avx(auVar195,auVar342);
    auVar106 = vsubps_avx(auVar218,auVar354);
    auVar147 = vsubps_avx(auVar241,auVar298);
    auVar235 = vshufps_avx(ZEXT416((uint)(local_c00 * 0.04761905)),
                           ZEXT416((uint)(local_c00 * 0.04761905)),0);
    fVar200 = auVar235._0_4_;
    fVar259 = fVar200 * auVar105._0_4_ * 3.0;
    fVar204 = auVar235._4_4_;
    fVar275 = fVar204 * auVar105._4_4_ * 3.0;
    local_aa0._4_4_ = fVar275;
    local_aa0._0_4_ = fVar259;
    fVar250 = auVar235._8_4_;
    fVar278 = fVar250 * auVar105._8_4_ * 3.0;
    fStack_a98 = fVar278;
    fVar226 = auVar235._12_4_;
    fVar281 = fVar226 * auVar105._12_4_ * 3.0;
    fStack_a94 = fVar281;
    fVar284 = fVar200 * auVar105._16_4_ * 3.0;
    unique0x10007b64 = fVar284;
    fVar287 = fVar204 * auVar105._20_4_ * 3.0;
    unique0x10007b68 = fVar287;
    fVar290 = fVar250 * auVar105._24_4_ * 3.0;
    unique0x10007b6c = fVar290;
    unique0x10007b70 = auVar266._28_4_;
    fVar292 = fVar200 * auVar265._0_4_ * 3.0;
    fVar302 = fVar204 * auVar265._4_4_ * 3.0;
    auVar394._4_4_ = fVar302;
    auVar394._0_4_ = fVar292;
    fVar303 = fVar250 * auVar265._8_4_ * 3.0;
    auVar394._8_4_ = fVar303;
    fVar305 = fVar226 * auVar265._12_4_ * 3.0;
    auVar394._12_4_ = fVar305;
    fVar307 = fVar200 * auVar265._16_4_ * 3.0;
    auVar394._16_4_ = fVar307;
    fVar309 = fVar204 * auVar265._20_4_ * 3.0;
    auVar394._20_4_ = fVar309;
    fVar311 = fVar250 * auVar265._24_4_ * 3.0;
    auVar394._24_4_ = fVar311;
    auVar394._28_4_ = auVar298._28_4_;
    fVar363 = fVar200 * auVar106._0_4_ * 3.0;
    fVar368 = fVar204 * auVar106._4_4_ * 3.0;
    auVar40._4_4_ = fVar368;
    auVar40._0_4_ = fVar363;
    fVar369 = fVar250 * auVar106._8_4_ * 3.0;
    auVar40._8_4_ = fVar369;
    fVar370 = fVar226 * auVar106._12_4_ * 3.0;
    auVar40._12_4_ = fVar370;
    fVar371 = fVar200 * auVar106._16_4_ * 3.0;
    auVar40._16_4_ = fVar371;
    fVar372 = fVar204 * auVar106._20_4_ * 3.0;
    auVar40._20_4_ = fVar372;
    fVar373 = fVar250 * auVar106._24_4_ * 3.0;
    auVar40._24_4_ = fVar373;
    auVar40._28_4_ = fVar374;
    fVar201 = fVar200 * auVar147._0_4_ * 3.0;
    fVar248 = fVar204 * auVar147._4_4_ * 3.0;
    auVar168._4_4_ = fVar248;
    auVar168._0_4_ = fVar201;
    fVar252 = fVar250 * auVar147._8_4_ * 3.0;
    auVar168._8_4_ = fVar252;
    fVar228 = fVar226 * auVar147._12_4_ * 3.0;
    auVar168._12_4_ = fVar228;
    fVar200 = fVar200 * auVar147._16_4_ * 3.0;
    auVar168._16_4_ = fVar200;
    fVar204 = fVar204 * auVar147._20_4_ * 3.0;
    auVar168._20_4_ = fVar204;
    fVar250 = fVar250 * auVar147._24_4_ * 3.0;
    auVar168._24_4_ = fVar250;
    auVar168._28_4_ = fVar226;
    auVar105 = vperm2f128_avx(auVar389,auVar389,1);
    auVar105 = vshufps_avx(auVar105,auVar389,0x30);
    auVar147 = vshufps_avx(auVar389,auVar105,0x29);
    auVar105 = vperm2f128_avx(auVar397,auVar397,1);
    auVar105 = vshufps_avx(auVar105,auVar397,0x30);
    _local_a80 = vshufps_avx(auVar397,auVar105,0x29);
    auVar265 = vsubps_avx(local_7a0,auVar168);
    auVar105 = vperm2f128_avx(auVar265,auVar265,1);
    auVar105 = vshufps_avx(auVar105,auVar265,0x30);
    auVar168 = vshufps_avx(auVar265,auVar105,0x29);
    auVar106 = vsubps_avx(auVar147,auVar389);
    auVar195 = vsubps_avx(_local_a80,auVar397);
    fVar89 = auVar106._0_4_;
    fVar223 = auVar106._4_4_;
    auVar34._4_4_ = fVar368 * fVar223;
    auVar34._0_4_ = fVar363 * fVar89;
    fVar202 = auVar106._8_4_;
    auVar34._8_4_ = fVar369 * fVar202;
    fVar230 = auVar106._12_4_;
    auVar34._12_4_ = fVar370 * fVar230;
    fVar255 = auVar106._16_4_;
    auVar34._16_4_ = fVar371 * fVar255;
    fVar286 = auVar106._20_4_;
    auVar34._20_4_ = fVar372 * fVar286;
    fVar23 = auVar106._24_4_;
    auVar34._24_4_ = fVar373 * fVar23;
    auVar34._28_4_ = auVar265._28_4_;
    fVar352 = auVar195._0_4_;
    fVar356 = auVar195._4_4_;
    auVar318._4_4_ = fVar356 * fVar302;
    auVar318._0_4_ = fVar352 * fVar292;
    fVar357 = auVar195._8_4_;
    auVar318._8_4_ = fVar357 * fVar303;
    fVar358 = auVar195._12_4_;
    auVar318._12_4_ = fVar358 * fVar305;
    fVar359 = auVar195._16_4_;
    auVar318._16_4_ = fVar359 * fVar307;
    fVar360 = auVar195._20_4_;
    auVar318._20_4_ = fVar360 * fVar309;
    fVar361 = auVar195._24_4_;
    auVar318._24_4_ = fVar361 * fVar311;
    auVar318._28_4_ = auVar105._28_4_;
    auVar34 = vsubps_avx(auVar318,auVar34);
    auVar105 = vperm2f128_avx(auVar377,auVar377,1);
    auVar105 = vshufps_avx(auVar105,auVar377,0x30);
    auVar195 = vshufps_avx(auVar377,auVar105,0x29);
    auVar218 = vsubps_avx(auVar195,auVar377);
    auVar393._4_4_ = fVar356 * fVar275;
    auVar393._0_4_ = fVar352 * fVar259;
    auVar393._8_4_ = fVar357 * fVar278;
    auVar393._12_4_ = fVar358 * fVar281;
    auVar393._16_4_ = fVar359 * fVar284;
    auVar393._20_4_ = fVar360 * fVar287;
    auVar393._24_4_ = fVar361 * fVar290;
    auVar393._28_4_ = auVar195._28_4_;
    fVar90 = auVar218._0_4_;
    fVar225 = auVar218._4_4_;
    auVar35._4_4_ = fVar368 * fVar225;
    auVar35._0_4_ = fVar363 * fVar90;
    fVar203 = auVar218._8_4_;
    auVar35._8_4_ = fVar369 * fVar203;
    fVar231 = auVar218._12_4_;
    auVar35._12_4_ = fVar370 * fVar231;
    fVar256 = auVar218._16_4_;
    auVar35._16_4_ = fVar371 * fVar256;
    fVar289 = auVar218._20_4_;
    auVar35._20_4_ = fVar372 * fVar289;
    fVar24 = auVar218._24_4_;
    auVar35._24_4_ = fVar373 * fVar24;
    auVar35._28_4_ = local_a80._28_4_;
    auVar318 = vsubps_avx(auVar35,auVar393);
    auVar36._4_4_ = fVar225 * fVar302;
    auVar36._0_4_ = fVar90 * fVar292;
    auVar36._8_4_ = fVar203 * fVar303;
    auVar36._12_4_ = fVar231 * fVar305;
    auVar36._16_4_ = fVar256 * fVar307;
    auVar36._20_4_ = fVar289 * fVar309;
    auVar36._24_4_ = fVar24 * fVar311;
    auVar36._28_4_ = local_a80._28_4_;
    auVar37._4_4_ = fVar275 * fVar223;
    auVar37._0_4_ = fVar259 * fVar89;
    auVar37._8_4_ = fVar278 * fVar202;
    auVar37._12_4_ = fVar281 * fVar230;
    auVar37._16_4_ = fVar284 * fVar255;
    auVar37._20_4_ = fVar287 * fVar286;
    auVar37._24_4_ = fVar290 * fVar23;
    auVar37._28_4_ = auVar342._28_4_;
    auVar393 = vsubps_avx(auVar37,auVar36);
    fVar257 = auVar393._28_4_;
    auVar167._0_4_ = fVar90 * fVar90 + fVar89 * fVar89 + fVar352 * fVar352;
    auVar167._4_4_ = fVar225 * fVar225 + fVar223 * fVar223 + fVar356 * fVar356;
    auVar167._8_4_ = fVar203 * fVar203 + fVar202 * fVar202 + fVar357 * fVar357;
    auVar167._12_4_ = fVar231 * fVar231 + fVar230 * fVar230 + fVar358 * fVar358;
    auVar167._16_4_ = fVar256 * fVar256 + fVar255 * fVar255 + fVar359 * fVar359;
    auVar167._20_4_ = fVar289 * fVar289 + fVar286 * fVar286 + fVar360 * fVar360;
    auVar167._24_4_ = fVar24 * fVar24 + fVar23 * fVar23 + fVar361 * fVar361;
    auVar167._28_4_ = fVar257 + fVar257 + auVar34._28_4_;
    auVar105 = vrcpps_avx(auVar167);
    fVar229 = auVar105._0_4_;
    fVar251 = auVar105._4_4_;
    auVar319._4_4_ = fVar251 * auVar167._4_4_;
    auVar319._0_4_ = fVar229 * auVar167._0_4_;
    fVar253 = auVar105._8_4_;
    auVar319._8_4_ = fVar253 * auVar167._8_4_;
    fVar254 = auVar105._12_4_;
    auVar319._12_4_ = fVar254 * auVar167._12_4_;
    fVar277 = auVar105._16_4_;
    auVar319._16_4_ = fVar277 * auVar167._16_4_;
    fVar280 = auVar105._20_4_;
    auVar319._20_4_ = fVar280 * auVar167._20_4_;
    fVar283 = auVar105._24_4_;
    auVar319._24_4_ = fVar283 * auVar167._24_4_;
    auVar319._28_4_ = auVar342._28_4_;
    auVar378._8_4_ = 0x3f800000;
    auVar378._0_8_ = 0x3f8000003f800000;
    auVar378._12_4_ = 0x3f800000;
    auVar378._16_4_ = 0x3f800000;
    auVar378._20_4_ = 0x3f800000;
    auVar378._24_4_ = 0x3f800000;
    auVar378._28_4_ = 0x3f800000;
    auVar35 = vsubps_avx(auVar378,auVar319);
    fVar229 = auVar35._0_4_ * fVar229 + fVar229;
    fVar251 = auVar35._4_4_ * fVar251 + fVar251;
    fVar253 = auVar35._8_4_ * fVar253 + fVar253;
    fVar254 = auVar35._12_4_ * fVar254 + fVar254;
    fVar277 = auVar35._16_4_ * fVar277 + fVar277;
    fVar280 = auVar35._20_4_ * fVar280 + fVar280;
    fVar283 = auVar35._24_4_ * fVar283 + fVar283;
    auVar265 = vperm2f128_avx(auVar394,auVar394,1);
    auVar265 = vshufps_avx(auVar265,auVar394,0x30);
    auVar265 = vshufps_avx(auVar394,auVar265,0x29);
    auVar106 = vperm2f128_avx(auVar40,auVar40,1);
    auVar106 = vshufps_avx(auVar106,auVar40,0x30);
    local_740 = vshufps_avx(auVar40,auVar106,0x29);
    fVar375 = local_740._0_4_;
    fVar382 = local_740._4_4_;
    auVar33._4_4_ = fVar382 * fVar223;
    auVar33._0_4_ = fVar375 * fVar89;
    fVar383 = local_740._8_4_;
    auVar33._8_4_ = fVar383 * fVar202;
    fVar384 = local_740._12_4_;
    auVar33._12_4_ = fVar384 * fVar230;
    fVar385 = local_740._16_4_;
    auVar33._16_4_ = fVar385 * fVar255;
    fVar386 = local_740._20_4_;
    auVar33._20_4_ = fVar386 * fVar286;
    fVar387 = local_740._24_4_;
    auVar33._24_4_ = fVar387 * fVar23;
    auVar33._28_4_ = auVar106._28_4_;
    fVar178 = auVar265._0_4_;
    fVar227 = auVar265._4_4_;
    auVar38._4_4_ = fVar356 * fVar227;
    auVar38._0_4_ = fVar352 * fVar178;
    fVar205 = auVar265._8_4_;
    auVar38._8_4_ = fVar357 * fVar205;
    fVar233 = auVar265._12_4_;
    auVar38._12_4_ = fVar358 * fVar233;
    fVar258 = auVar265._16_4_;
    auVar38._16_4_ = fVar359 * fVar258;
    fVar362 = auVar265._20_4_;
    auVar38._20_4_ = fVar360 * fVar362;
    fVar25 = auVar265._24_4_;
    auVar38._24_4_ = fVar361 * fVar25;
    auVar38._28_4_ = fVar374;
    auVar106 = vsubps_avx(auVar38,auVar33);
    auVar265 = vperm2f128_avx(_local_aa0,_local_aa0,1);
    auVar265 = vshufps_avx(auVar265,_local_aa0,0x30);
    local_940 = vshufps_avx(_local_aa0,auVar265,0x29);
    fVar199 = local_940._0_4_;
    fVar232 = local_940._4_4_;
    auVar39._4_4_ = fVar356 * fVar232;
    auVar39._0_4_ = fVar352 * fVar199;
    fVar224 = local_940._8_4_;
    auVar39._8_4_ = fVar357 * fVar224;
    fVar249 = local_940._12_4_;
    auVar39._12_4_ = fVar358 * fVar249;
    fVar274 = local_940._16_4_;
    auVar39._16_4_ = fVar359 * fVar274;
    fVar374 = local_940._20_4_;
    auVar39._20_4_ = fVar360 * fVar374;
    fVar26 = local_940._24_4_;
    auVar39._24_4_ = fVar361 * fVar26;
    auVar39._28_4_ = auVar265._28_4_;
    auVar41._4_4_ = fVar382 * fVar225;
    auVar41._0_4_ = fVar375 * fVar90;
    auVar41._8_4_ = fVar383 * fVar203;
    auVar41._12_4_ = fVar384 * fVar231;
    auVar41._16_4_ = fVar385 * fVar256;
    auVar41._20_4_ = fVar386 * fVar289;
    uVar81 = local_740._28_4_;
    auVar41._24_4_ = fVar387 * fVar24;
    auVar41._28_4_ = uVar81;
    auVar265 = vsubps_avx(auVar41,auVar39);
    auVar42._4_4_ = fVar225 * fVar227;
    auVar42._0_4_ = fVar90 * fVar178;
    auVar42._8_4_ = fVar203 * fVar205;
    auVar42._12_4_ = fVar231 * fVar233;
    auVar42._16_4_ = fVar256 * fVar258;
    auVar42._20_4_ = fVar289 * fVar362;
    auVar42._24_4_ = fVar24 * fVar25;
    auVar42._28_4_ = uVar81;
    auVar43._4_4_ = fVar232 * fVar223;
    auVar43._0_4_ = fVar199 * fVar89;
    auVar43._8_4_ = fVar224 * fVar202;
    auVar43._12_4_ = fVar249 * fVar230;
    auVar43._16_4_ = fVar274 * fVar255;
    auVar43._20_4_ = fVar374 * fVar286;
    auVar43._24_4_ = fVar26 * fVar23;
    auVar43._28_4_ = auVar389._28_4_;
    auVar394 = vsubps_avx(auVar43,auVar42);
    auVar44._4_4_ =
         (auVar34._4_4_ * auVar34._4_4_ +
         auVar318._4_4_ * auVar318._4_4_ + auVar393._4_4_ * auVar393._4_4_) * fVar251;
    auVar44._0_4_ =
         (auVar34._0_4_ * auVar34._0_4_ +
         auVar318._0_4_ * auVar318._0_4_ + auVar393._0_4_ * auVar393._0_4_) * fVar229;
    auVar44._8_4_ =
         (auVar34._8_4_ * auVar34._8_4_ +
         auVar318._8_4_ * auVar318._8_4_ + auVar393._8_4_ * auVar393._8_4_) * fVar253;
    auVar44._12_4_ =
         (auVar34._12_4_ * auVar34._12_4_ +
         auVar318._12_4_ * auVar318._12_4_ + auVar393._12_4_ * auVar393._12_4_) * fVar254;
    auVar44._16_4_ =
         (auVar34._16_4_ * auVar34._16_4_ +
         auVar318._16_4_ * auVar318._16_4_ + auVar393._16_4_ * auVar393._16_4_) * fVar277;
    auVar44._20_4_ =
         (auVar34._20_4_ * auVar34._20_4_ +
         auVar318._20_4_ * auVar318._20_4_ + auVar393._20_4_ * auVar393._20_4_) * fVar280;
    auVar44._24_4_ =
         (auVar34._24_4_ * auVar34._24_4_ +
         auVar318._24_4_ * auVar318._24_4_ + auVar393._24_4_ * auVar393._24_4_) * fVar283;
    auVar44._28_4_ = auVar34._28_4_ + auVar318._28_4_ + fVar257;
    auVar45._4_4_ =
         (auVar106._4_4_ * auVar106._4_4_ +
         auVar265._4_4_ * auVar265._4_4_ + auVar394._4_4_ * auVar394._4_4_) * fVar251;
    auVar45._0_4_ =
         (auVar106._0_4_ * auVar106._0_4_ +
         auVar265._0_4_ * auVar265._0_4_ + auVar394._0_4_ * auVar394._0_4_) * fVar229;
    auVar45._8_4_ =
         (auVar106._8_4_ * auVar106._8_4_ +
         auVar265._8_4_ * auVar265._8_4_ + auVar394._8_4_ * auVar394._8_4_) * fVar253;
    auVar45._12_4_ =
         (auVar106._12_4_ * auVar106._12_4_ +
         auVar265._12_4_ * auVar265._12_4_ + auVar394._12_4_ * auVar394._12_4_) * fVar254;
    auVar45._16_4_ =
         (auVar106._16_4_ * auVar106._16_4_ +
         auVar265._16_4_ * auVar265._16_4_ + auVar394._16_4_ * auVar394._16_4_) * fVar277;
    auVar45._20_4_ =
         (auVar106._20_4_ * auVar106._20_4_ +
         auVar265._20_4_ * auVar265._20_4_ + auVar394._20_4_ * auVar394._20_4_) * fVar280;
    auVar45._24_4_ =
         (auVar106._24_4_ * auVar106._24_4_ +
         auVar265._24_4_ * auVar265._24_4_ + auVar394._24_4_ * auVar394._24_4_) * fVar283;
    auVar45._28_4_ = auVar35._28_4_ + auVar105._28_4_;
    auVar105 = vmaxps_avx(auVar44,auVar45);
    auVar265 = vperm2f128_avx(local_7a0,local_7a0,1);
    auVar265 = vshufps_avx(auVar265,local_7a0,0x30);
    auVar34 = vshufps_avx(local_7a0,auVar265,0x29);
    auVar107._0_4_ = (float)local_7a0._0_4_ + fVar201;
    auVar107._4_4_ = local_7a0._4_4_ + fVar248;
    auVar107._8_4_ = local_7a0._8_4_ + fVar252;
    auVar107._12_4_ = local_7a0._12_4_ + fVar228;
    auVar107._16_4_ = local_7a0._16_4_ + fVar200;
    auVar107._20_4_ = local_7a0._20_4_ + fVar204;
    auVar107._24_4_ = local_7a0._24_4_ + fVar250;
    auVar107._28_4_ = local_7a0._28_4_ + fVar226;
    auVar265 = vmaxps_avx(local_7a0,auVar107);
    auVar106 = vmaxps_avx(auVar168,auVar34);
    auVar265 = vmaxps_avx(auVar265,auVar106);
    auVar106 = vrsqrtps_avx(auVar167);
    fVar257 = auVar106._0_4_;
    fVar200 = auVar106._4_4_;
    fVar201 = auVar106._8_4_;
    fVar204 = auVar106._12_4_;
    fVar248 = auVar106._16_4_;
    fVar250 = auVar106._20_4_;
    fVar252 = auVar106._24_4_;
    local_340 = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar167._0_4_ * -0.5;
    fStack_33c = fVar200 * 1.5 + fVar200 * fVar200 * fVar200 * auVar167._4_4_ * -0.5;
    fStack_338 = fVar201 * 1.5 + fVar201 * fVar201 * fVar201 * auVar167._8_4_ * -0.5;
    fStack_334 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar167._12_4_ * -0.5;
    fStack_330 = fVar248 * 1.5 + fVar248 * fVar248 * fVar248 * auVar167._16_4_ * -0.5;
    fStack_32c = fVar250 * 1.5 + fVar250 * fVar250 * fVar250 * auVar167._20_4_ * -0.5;
    fStack_328 = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar167._24_4_ * -0.5;
    auVar318 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar393 = vsubps_avx(auVar318,auVar389);
    auVar35 = vsubps_avx(auVar318,auVar397);
    fVar200 = auVar35._0_4_;
    fVar248 = auVar35._4_4_;
    fVar226 = auVar35._8_4_;
    fVar251 = auVar35._12_4_;
    fVar277 = auVar35._16_4_;
    fVar20 = auVar35._20_4_;
    fVar27 = auVar35._24_4_;
    fVar201 = auVar393._0_4_;
    fVar250 = auVar393._4_4_;
    fVar228 = auVar393._8_4_;
    fVar253 = auVar393._12_4_;
    fVar280 = auVar393._16_4_;
    fVar21 = auVar393._20_4_;
    fVar28 = auVar393._24_4_;
    auVar319 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar36 = vsubps_avx(auVar319,auVar377);
    fVar204 = auVar36._0_4_;
    fVar252 = auVar36._4_4_;
    fVar229 = auVar36._8_4_;
    fVar254 = auVar36._12_4_;
    fVar283 = auVar36._16_4_;
    fVar22 = auVar36._20_4_;
    fVar29 = auVar36._24_4_;
    auVar379._0_4_ =
         (float)local_800._0_4_ * fVar204 +
         (float)local_820._0_4_ * fVar201 + (float)local_7c0._0_4_ * fVar200;
    auVar379._4_4_ =
         (float)local_800._4_4_ * fVar252 +
         (float)local_820._4_4_ * fVar250 + (float)local_7c0._4_4_ * fVar248;
    auVar379._8_4_ = fStack_7f8 * fVar229 + fStack_818 * fVar228 + fStack_7b8 * fVar226;
    auVar379._12_4_ = fStack_7f4 * fVar254 + fStack_814 * fVar253 + fStack_7b4 * fVar251;
    auVar379._16_4_ = fStack_7f0 * fVar283 + fStack_810 * fVar280 + fStack_7b0 * fVar277;
    auVar379._20_4_ = fStack_7ec * fVar22 + fStack_80c * fVar21 + fStack_7ac * fVar20;
    auVar379._24_4_ = fStack_7e8 * fVar29 + fStack_808 * fVar28 + fStack_7a8 * fVar27;
    auVar379._28_4_ = auVar389._28_4_ + auVar394._28_4_ + 1.5;
    auVar390._0_4_ = fVar204 * fVar204 + fVar201 * fVar201 + fVar200 * fVar200;
    auVar390._4_4_ = fVar252 * fVar252 + fVar250 * fVar250 + fVar248 * fVar248;
    auVar390._8_4_ = fVar229 * fVar229 + fVar228 * fVar228 + fVar226 * fVar226;
    auVar390._12_4_ = fVar254 * fVar254 + fVar253 * fVar253 + fVar251 * fVar251;
    auVar390._16_4_ = fVar283 * fVar283 + fVar280 * fVar280 + fVar277 * fVar277;
    auVar390._20_4_ = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
    auVar390._24_4_ = fVar29 * fVar29 + fVar28 * fVar28 + fVar27 * fVar27;
    auVar390._28_4_ = auVar397._28_4_ + auVar397._28_4_ + auVar389._28_4_;
    fVar326 = (float)local_800._0_4_ * fVar90 * local_340 +
              local_340 * fVar89 * (float)local_820._0_4_ +
              fVar352 * local_340 * (float)local_7c0._0_4_;
    fVar330 = (float)local_800._4_4_ * fVar225 * fStack_33c +
              fStack_33c * fVar223 * (float)local_820._4_4_ +
              fVar356 * fStack_33c * (float)local_7c0._4_4_;
    fVar331 = fStack_7f8 * fVar203 * fStack_338 +
              fStack_338 * fVar202 * fStack_818 + fVar357 * fStack_338 * fStack_7b8;
    fVar332 = fStack_7f4 * fVar231 * fStack_334 +
              fStack_334 * fVar230 * fStack_814 + fVar358 * fStack_334 * fStack_7b4;
    fVar333 = fStack_7f0 * fVar256 * fStack_330 +
              fStack_330 * fVar255 * fStack_810 + fVar359 * fStack_330 * fStack_7b0;
    fVar335 = fStack_7ec * fVar289 * fStack_32c +
              fStack_32c * fVar286 * fStack_80c + fVar360 * fStack_32c * fStack_7ac;
    fVar337 = fStack_7e8 * fVar24 * fStack_328 +
              fStack_328 * fVar23 * fStack_808 + fVar361 * fStack_328 * fStack_7a8;
    fVar257 = fStack_7e4 + fStack_804 + fStack_7a4;
    fVar339 = fVar204 * fVar90 * local_340 +
              local_340 * fVar89 * fVar201 + fVar352 * local_340 * fVar200;
    fVar345 = fVar252 * fVar225 * fStack_33c +
              fStack_33c * fVar223 * fVar250 + fVar356 * fStack_33c * fVar248;
    fVar346 = fVar229 * fVar203 * fStack_338 +
              fStack_338 * fVar202 * fVar228 + fVar357 * fStack_338 * fVar226;
    fVar347 = fVar254 * fVar231 * fStack_334 +
              fStack_334 * fVar230 * fVar253 + fVar358 * fStack_334 * fVar251;
    fVar348 = fVar283 * fVar256 * fStack_330 +
              fStack_330 * fVar255 * fVar280 + fVar359 * fStack_330 * fVar277;
    fVar349 = fVar22 * fVar289 * fStack_32c +
              fStack_32c * fVar286 * fVar21 + fVar360 * fStack_32c * fVar20;
    fVar350 = fVar29 * fVar24 * fStack_328 +
              fStack_328 * fVar23 * fVar28 + fVar361 * fStack_328 * fVar27;
    fVar351 = fStack_804 + fVar257;
    auVar46._4_4_ = fVar330 * fVar345;
    auVar46._0_4_ = fVar326 * fVar339;
    auVar46._8_4_ = fVar331 * fVar346;
    auVar46._12_4_ = fVar332 * fVar347;
    auVar46._16_4_ = fVar333 * fVar348;
    auVar46._20_4_ = fVar335 * fVar349;
    auVar46._24_4_ = fVar337 * fVar350;
    auVar46._28_4_ = fVar257;
    auVar394 = vsubps_avx(auVar379,auVar46);
    auVar47._4_4_ = fVar345 * fVar345;
    auVar47._0_4_ = fVar339 * fVar339;
    auVar47._8_4_ = fVar346 * fVar346;
    auVar47._12_4_ = fVar347 * fVar347;
    auVar47._16_4_ = fVar348 * fVar348;
    auVar47._20_4_ = fVar349 * fVar349;
    auVar47._24_4_ = fVar350 * fVar350;
    auVar47._28_4_ = fStack_804;
    auVar37 = vsubps_avx(auVar390,auVar47);
    auVar318 = vsqrtps_avx(auVar105);
    fVar257 = (auVar318._0_4_ + auVar265._0_4_) * 1.0000002;
    fVar121 = (auVar318._4_4_ + auVar265._4_4_) * 1.0000002;
    fVar123 = (auVar318._8_4_ + auVar265._8_4_) * 1.0000002;
    fVar125 = (auVar318._12_4_ + auVar265._12_4_) * 1.0000002;
    fVar126 = (auVar318._16_4_ + auVar265._16_4_) * 1.0000002;
    fVar127 = (auVar318._20_4_ + auVar265._20_4_) * 1.0000002;
    fVar128 = (auVar318._24_4_ + auVar265._24_4_) * 1.0000002;
    auVar48._4_4_ = fVar121 * fVar121;
    auVar48._0_4_ = fVar257 * fVar257;
    auVar48._8_4_ = fVar123 * fVar123;
    auVar48._12_4_ = fVar125 * fVar125;
    auVar48._16_4_ = fVar126 * fVar126;
    auVar48._20_4_ = fVar127 * fVar127;
    auVar48._24_4_ = fVar128 * fVar128;
    auVar48._28_4_ = auVar318._28_4_ + auVar265._28_4_;
    fVar121 = auVar394._0_4_ + auVar394._0_4_;
    fVar123 = auVar394._4_4_ + auVar394._4_4_;
    local_900._0_8_ = CONCAT44(fVar123,fVar121);
    local_900._8_4_ = auVar394._8_4_ + auVar394._8_4_;
    local_900._12_4_ = auVar394._12_4_ + auVar394._12_4_;
    local_900._16_4_ = auVar394._16_4_ + auVar394._16_4_;
    local_900._20_4_ = auVar394._20_4_ + auVar394._20_4_;
    local_900._24_4_ = auVar394._24_4_ + auVar394._24_4_;
    fVar257 = auVar394._28_4_;
    local_900._28_4_ = fVar257 + fVar257;
    auVar265 = vsubps_avx(auVar37,auVar48);
    local_360._4_4_ = fVar330 * fVar330;
    local_360._0_4_ = fVar326 * fVar326;
    local_360._8_4_ = fVar331 * fVar331;
    local_360._12_4_ = fVar332 * fVar332;
    local_360._16_4_ = fVar333 * fVar333;
    local_360._20_4_ = fVar335 * fVar335;
    local_360._24_4_ = fVar337 * fVar337;
    local_360._28_4_ = auVar37._28_4_;
    local_4a0 = vsubps_avx(local_2a0,local_360);
    auVar49._4_4_ = fVar123 * fVar123;
    auVar49._0_4_ = fVar121 * fVar121;
    auVar49._8_4_ = local_900._8_4_ * local_900._8_4_;
    auVar49._12_4_ = local_900._12_4_ * local_900._12_4_;
    auVar49._16_4_ = local_900._16_4_ * local_900._16_4_;
    auVar49._20_4_ = local_900._20_4_ * local_900._20_4_;
    auVar49._24_4_ = local_900._24_4_ * local_900._24_4_;
    auVar49._28_4_ = fVar257;
    fVar125 = local_4a0._0_4_;
    fVar126 = local_4a0._4_4_;
    fVar127 = local_4a0._8_4_;
    fStack_8d8 = fVar127 * 4.0;
    fVar128 = local_4a0._12_4_;
    fStack_8d4 = fVar128 * 4.0;
    fVar334 = local_4a0._16_4_;
    fStack_8d0 = fVar334 * 4.0;
    fVar336 = local_4a0._20_4_;
    fStack_8cc = fVar336 * 4.0;
    fVar338 = local_4a0._24_4_;
    fStack_8c8 = fVar338 * 4.0;
    uStack_8c4 = 0x40800000;
    auVar50._4_4_ = auVar265._4_4_ * fVar126 * 4.0;
    auVar50._0_4_ = auVar265._0_4_ * fVar125 * 4.0;
    auVar50._8_4_ = auVar265._8_4_ * fStack_8d8;
    auVar50._12_4_ = auVar265._12_4_ * fStack_8d4;
    auVar50._16_4_ = auVar265._16_4_ * fStack_8d0;
    auVar50._20_4_ = auVar265._20_4_ * fStack_8cc;
    auVar50._24_4_ = auVar265._24_4_ * fStack_8c8;
    auVar50._28_4_ = 0x40800000;
    auVar394 = vsubps_avx(auVar49,auVar50);
    auVar105 = vcmpps_avx(auVar394,auVar319,5);
    fVar257 = local_4a0._28_4_;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar320._8_4_ = 0x7f800000;
      auVar320._0_8_ = 0x7f8000007f800000;
      auVar320._12_4_ = 0x7f800000;
      auVar320._16_4_ = 0x7f800000;
      auVar320._20_4_ = 0x7f800000;
      auVar320._24_4_ = 0x7f800000;
      auVar320._28_4_ = 0x7f800000;
      auVar391._8_4_ = 0xff800000;
      auVar391._0_8_ = 0xff800000ff800000;
      auVar391._12_4_ = 0xff800000;
      auVar391._16_4_ = 0xff800000;
      auVar391._20_4_ = 0xff800000;
      auVar391._24_4_ = 0xff800000;
      auVar391._28_4_ = 0xff800000;
    }
    else {
      auVar319 = vcmpps_avx(auVar394,auVar319,5);
      auVar33 = vsqrtps_avx(auVar394);
      auVar267._0_4_ = fVar125 + fVar125;
      auVar267._4_4_ = fVar126 + fVar126;
      auVar267._8_4_ = fVar127 + fVar127;
      auVar267._12_4_ = fVar128 + fVar128;
      auVar267._16_4_ = fVar334 + fVar334;
      auVar267._20_4_ = fVar336 + fVar336;
      auVar267._24_4_ = fVar338 + fVar338;
      auVar267._28_4_ = fVar257 + fVar257;
      auVar394 = vrcpps_avx(auVar267);
      fVar260 = auVar394._0_4_;
      fVar276 = auVar394._4_4_;
      auVar51._4_4_ = auVar267._4_4_ * fVar276;
      auVar51._0_4_ = auVar267._0_4_ * fVar260;
      fVar279 = auVar394._8_4_;
      auVar51._8_4_ = auVar267._8_4_ * fVar279;
      fVar282 = auVar394._12_4_;
      auVar51._12_4_ = auVar267._12_4_ * fVar282;
      fVar285 = auVar394._16_4_;
      auVar51._16_4_ = auVar267._16_4_ * fVar285;
      fVar288 = auVar394._20_4_;
      auVar51._20_4_ = auVar267._20_4_ * fVar288;
      fVar291 = auVar394._24_4_;
      auVar51._24_4_ = auVar267._24_4_ * fVar291;
      auVar51._28_4_ = auVar267._28_4_;
      auVar321._8_4_ = 0x3f800000;
      auVar321._0_8_ = 0x3f8000003f800000;
      auVar321._12_4_ = 0x3f800000;
      auVar321._16_4_ = 0x3f800000;
      auVar321._20_4_ = 0x3f800000;
      auVar321._24_4_ = 0x3f800000;
      auVar321._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar321,auVar51);
      fVar260 = fVar260 + fVar260 * auVar38._0_4_;
      fVar276 = fVar276 + fVar276 * auVar38._4_4_;
      fVar279 = fVar279 + fVar279 * auVar38._8_4_;
      fVar282 = fVar282 + fVar282 * auVar38._12_4_;
      fVar285 = fVar285 + fVar285 * auVar38._16_4_;
      fVar288 = fVar288 + fVar288 * auVar38._20_4_;
      fVar291 = fVar291 + fVar291 * auVar38._24_4_;
      auVar299._0_8_ = CONCAT44(fVar123,fVar121) ^ 0x8000000080000000;
      auVar299._8_4_ = -local_900._8_4_;
      auVar299._12_4_ = -local_900._12_4_;
      auVar299._16_4_ = -local_900._16_4_;
      auVar299._20_4_ = -local_900._20_4_;
      auVar299._24_4_ = -local_900._24_4_;
      auVar299._28_4_ = -local_900._28_4_;
      auVar39 = vsubps_avx(auVar299,auVar33);
      fVar121 = auVar39._0_4_ * fVar260;
      fVar123 = auVar39._4_4_ * fVar276;
      auVar52._4_4_ = fVar123;
      auVar52._0_4_ = fVar121;
      fVar304 = auVar39._8_4_ * fVar279;
      auVar52._8_4_ = fVar304;
      fVar306 = auVar39._12_4_ * fVar282;
      auVar52._12_4_ = fVar306;
      fVar308 = auVar39._16_4_ * fVar285;
      auVar52._16_4_ = fVar308;
      fVar310 = auVar39._20_4_ * fVar288;
      auVar52._20_4_ = fVar310;
      fVar312 = auVar39._24_4_ * fVar291;
      auVar52._24_4_ = fVar312;
      auVar52._28_4_ = auVar39._28_4_;
      auVar33 = vsubps_avx(auVar33,local_900);
      fVar260 = auVar33._0_4_ * fVar260;
      fVar276 = auVar33._4_4_ * fVar276;
      auVar53._4_4_ = fVar276;
      auVar53._0_4_ = fVar260;
      fVar279 = auVar33._8_4_ * fVar279;
      auVar53._8_4_ = fVar279;
      fVar282 = auVar33._12_4_ * fVar282;
      auVar53._12_4_ = fVar282;
      fVar285 = auVar33._16_4_ * fVar285;
      auVar53._16_4_ = fVar285;
      fVar288 = auVar33._20_4_ * fVar288;
      auVar53._20_4_ = fVar288;
      fVar291 = auVar33._24_4_ * fVar291;
      auVar53._24_4_ = fVar291;
      auVar53._28_4_ = auVar33._28_4_;
      local_960._4_4_ = fStack_33c * (fVar345 + fVar330 * fVar123);
      local_960._0_4_ = local_340 * (fVar339 + fVar326 * fVar121);
      uStack_958._0_4_ = (uint)(fStack_338 * (fVar346 + fVar331 * fVar304));
      uStack_958._4_4_ = (uint)(fStack_334 * (fVar347 + fVar332 * fVar306));
      uStack_950._0_4_ = (uint)(fStack_330 * (fVar348 + fVar333 * fVar308));
      uStack_950._4_4_ = (uint)(fStack_32c * (fVar349 + fVar335 * fVar310));
      uStack_948._0_4_ = (uint)(fStack_328 * (fVar350 + fVar337 * fVar312));
      uStack_948._4_4_ = (uint)(fVar351 + auVar394._28_4_ + auVar38._28_4_);
      auVar322._8_4_ = 0x7fffffff;
      auVar322._0_8_ = 0x7fffffff7fffffff;
      auVar322._12_4_ = 0x7fffffff;
      auVar322._16_4_ = 0x7fffffff;
      auVar322._20_4_ = 0x7fffffff;
      auVar322._24_4_ = 0x7fffffff;
      auVar322._28_4_ = 0x7fffffff;
      auVar394 = vandps_avx(local_360,auVar322);
      auVar33 = vmaxps_avx(local_440,auVar394);
      auVar54._4_4_ = auVar33._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar33._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar33._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar33._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar33._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar33._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar33._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar33._28_4_;
      auVar394 = vandps_avx(local_4a0,auVar322);
      auVar394 = vcmpps_avx(auVar394,auVar54,1);
      auVar323._8_4_ = 0x7f800000;
      auVar323._0_8_ = 0x7f8000007f800000;
      auVar323._12_4_ = 0x7f800000;
      auVar323._16_4_ = 0x7f800000;
      auVar323._20_4_ = 0x7f800000;
      auVar323._24_4_ = 0x7f800000;
      auVar323._28_4_ = 0x7f800000;
      auVar320 = vblendvps_avx(auVar323,auVar52,auVar319);
      local_320 = local_340 * (fVar339 + fVar326 * fVar260);
      fStack_31c = fStack_33c * (fVar345 + fVar330 * fVar276);
      fStack_318 = fStack_338 * (fVar346 + fVar331 * fVar279);
      fStack_314 = fStack_334 * (fVar347 + fVar332 * fVar282);
      fStack_310 = fStack_330 * (fVar348 + fVar333 * fVar285);
      fStack_30c = fStack_32c * (fVar349 + fVar335 * fVar288);
      fStack_308 = fStack_328 * (fVar350 + fVar337 * fVar291);
      fStack_304 = fVar351 + auVar33._28_4_;
      auVar268._8_4_ = 0xff800000;
      auVar268._0_8_ = 0xff800000ff800000;
      auVar268._12_4_ = 0xff800000;
      auVar268._16_4_ = 0xff800000;
      auVar268._20_4_ = 0xff800000;
      auVar268._24_4_ = 0xff800000;
      auVar268._28_4_ = 0xff800000;
      auVar391 = vblendvps_avx(auVar268,auVar53,auVar319);
      auVar33 = auVar319 & auVar394;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0x7f,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0xbf,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar33[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar394,auVar319);
        auVar235 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
        auVar394 = vcmpps_avx(auVar265,ZEXT832(0) << 0x20,2);
        auVar381._8_4_ = 0xff800000;
        auVar381._0_8_ = 0xff800000ff800000;
        auVar381._12_4_ = 0xff800000;
        auVar381._16_4_ = 0xff800000;
        auVar381._20_4_ = 0xff800000;
        auVar381._24_4_ = 0xff800000;
        auVar381._28_4_ = 0xff800000;
        auVar398._8_4_ = 0x7f800000;
        auVar398._0_8_ = 0x7f8000007f800000;
        auVar398._12_4_ = 0x7f800000;
        auVar398._16_4_ = 0x7f800000;
        auVar398._20_4_ = 0x7f800000;
        auVar398._24_4_ = 0x7f800000;
        auVar398._28_4_ = 0x7f800000;
        auVar265 = vblendvps_avx(auVar398,auVar381,auVar394);
        auVar136 = vpmovsxwd_avx(auVar235);
        auVar235 = vpunpckhwd_avx(auVar235,auVar235);
        auVar247._16_16_ = auVar235;
        auVar247._0_16_ = auVar136;
        auVar320 = vblendvps_avx(auVar320,auVar265,auVar247);
        auVar265 = vblendvps_avx(auVar381,auVar398,auVar394);
        auVar391 = vblendvps_avx(auVar391,auVar265,auVar247);
        auVar265 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar118._0_4_ = auVar105._0_4_ ^ auVar265._0_4_;
        auVar118._4_4_ = auVar105._4_4_ ^ auVar265._4_4_;
        auVar118._8_4_ = auVar105._8_4_ ^ auVar265._8_4_;
        auVar118._12_4_ = auVar105._12_4_ ^ auVar265._12_4_;
        auVar118._16_4_ = auVar105._16_4_ ^ auVar265._16_4_;
        auVar118._20_4_ = auVar105._20_4_ ^ auVar265._20_4_;
        auVar118._24_4_ = auVar105._24_4_ ^ auVar265._24_4_;
        auVar118._28_4_ = auVar105._28_4_ ^ auVar265._28_4_;
        auVar105 = vorps_avx(auVar394,auVar118);
        auVar105 = vandps_avx(auVar319,auVar105);
      }
    }
    auVar400 = ZEXT3264(local_a20);
    auVar265 = local_400 & auVar105;
    auVar273 = ZEXT3264(local_a60);
    if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar265 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar265 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar265 >> 0x7f,0) == '\0') &&
          (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar265 >> 0xbf,0) == '\0') &&
        (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar265[0x1f])
    {
      auVar325 = ZEXT3264(local_9a0);
      auVar355 = ZEXT3264(local_9c0);
      auVar367 = ZEXT3264(local_9e0);
      auVar396 = ZEXT3264(local_a00);
    }
    else {
      fStack_324 = auVar106._28_4_ + auVar167._28_4_;
      auVar136 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      local_6c0._0_16_ = auVar136;
      auVar235 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_880._0_4_));
      auVar235 = vshufps_avx(auVar235,auVar235,0);
      auVar242._16_16_ = auVar235;
      auVar242._0_16_ = auVar235;
      auVar394 = vminps_avx(auVar242,auVar391);
      fVar288 = auVar35._28_4_;
      auVar148._0_4_ =
           (float)local_800._0_4_ * fVar259 +
           (float)local_820._0_4_ * fVar292 + (float)local_7c0._0_4_ * fVar363;
      auVar148._4_4_ =
           (float)local_800._4_4_ * fVar275 +
           (float)local_820._4_4_ * fVar302 + (float)local_7c0._4_4_ * fVar368;
      auVar148._8_4_ = fStack_7f8 * fVar278 + fStack_818 * fVar303 + fStack_7b8 * fVar369;
      auVar148._12_4_ = fStack_7f4 * fVar281 + fStack_814 * fVar305 + fStack_7b4 * fVar370;
      auVar148._16_4_ = fStack_7f0 * fVar284 + fStack_810 * fVar307 + fStack_7b0 * fVar371;
      auVar148._20_4_ = fStack_7ec * fVar287 + fStack_80c * fVar309 + fStack_7ac * fVar372;
      auVar148._24_4_ = fStack_7e8 * fVar290 + fStack_808 * fVar311 + fStack_7a8 * fVar373;
      auVar148._28_4_ = fVar288 + auVar298._28_4_ + fVar288;
      auVar265 = vrcpps_avx(auVar148);
      fVar121 = auVar265._0_4_;
      fVar123 = auVar265._4_4_;
      auVar55._4_4_ = auVar148._4_4_ * fVar123;
      auVar55._0_4_ = auVar148._0_4_ * fVar121;
      fVar260 = auVar265._8_4_;
      auVar55._8_4_ = auVar148._8_4_ * fVar260;
      fVar276 = auVar265._12_4_;
      auVar55._12_4_ = auVar148._12_4_ * fVar276;
      fVar279 = auVar265._16_4_;
      auVar55._16_4_ = auVar148._16_4_ * fVar279;
      fVar282 = auVar265._20_4_;
      auVar55._20_4_ = auVar148._20_4_ * fVar282;
      fVar285 = auVar265._24_4_;
      auVar55._24_4_ = auVar148._24_4_ * fVar285;
      auVar55._28_4_ = auVar36._28_4_;
      auVar380._8_4_ = 0x3f800000;
      auVar380._0_8_ = 0x3f8000003f800000;
      auVar380._12_4_ = 0x3f800000;
      auVar380._16_4_ = 0x3f800000;
      auVar380._20_4_ = 0x3f800000;
      auVar380._24_4_ = 0x3f800000;
      auVar380._28_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar380,auVar55);
      auVar300._8_4_ = 0x7fffffff;
      auVar300._0_8_ = 0x7fffffff7fffffff;
      auVar300._12_4_ = 0x7fffffff;
      auVar300._16_4_ = 0x7fffffff;
      auVar300._20_4_ = 0x7fffffff;
      auVar300._24_4_ = 0x7fffffff;
      auVar300._28_4_ = 0x7fffffff;
      auVar265 = vandps_avx(auVar148,auVar300);
      auVar392._8_4_ = 0x219392ef;
      auVar392._0_8_ = 0x219392ef219392ef;
      auVar392._12_4_ = 0x219392ef;
      auVar392._16_4_ = 0x219392ef;
      auVar392._20_4_ = 0x219392ef;
      auVar392._24_4_ = 0x219392ef;
      auVar392._28_4_ = 0x219392ef;
      auVar106 = vcmpps_avx(auVar265,auVar392,1);
      auVar56._4_4_ =
           (fVar123 + fVar123 * auVar35._4_4_) *
           -(fVar252 * fVar275 + fVar250 * fVar302 + fVar248 * fVar368);
      auVar56._0_4_ =
           (fVar121 + fVar121 * auVar35._0_4_) *
           -(fVar204 * fVar259 + fVar201 * fVar292 + fVar200 * fVar363);
      auVar56._8_4_ =
           (fVar260 + fVar260 * auVar35._8_4_) *
           -(fVar229 * fVar278 + fVar228 * fVar303 + fVar226 * fVar369);
      auVar56._12_4_ =
           (fVar276 + fVar276 * auVar35._12_4_) *
           -(fVar254 * fVar281 + fVar253 * fVar305 + fVar251 * fVar370);
      auVar56._16_4_ =
           (fVar279 + fVar279 * auVar35._16_4_) *
           -(fVar283 * fVar284 + fVar280 * fVar307 + fVar277 * fVar371);
      auVar56._20_4_ =
           (fVar282 + fVar282 * auVar35._20_4_) *
           -(fVar22 * fVar287 + fVar21 * fVar309 + fVar20 * fVar372);
      auVar56._24_4_ =
           (fVar285 + fVar285 * auVar35._24_4_) *
           -(fVar29 * fVar290 + fVar28 * fVar311 + fVar27 * fVar373);
      auVar56._28_4_ = -(fVar288 + auVar393._28_4_ + fVar288);
      auVar393 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar265 = vcmpps_avx(auVar148,auVar393,1);
      auVar265 = vorps_avx(auVar106,auVar265);
      auVar324._8_4_ = 0xff800000;
      auVar324._0_8_ = 0xff800000ff800000;
      auVar324._12_4_ = 0xff800000;
      auVar324._16_4_ = 0xff800000;
      auVar324._20_4_ = 0xff800000;
      auVar324._24_4_ = 0xff800000;
      auVar324._28_4_ = 0xff800000;
      auVar265 = vblendvps_avx(auVar56,auVar324,auVar265);
      auVar393 = vcmpps_avx(auVar148,auVar393,6);
      auVar106 = vorps_avx(auVar106,auVar393);
      auVar329._8_4_ = 0x7f800000;
      auVar329._0_8_ = 0x7f8000007f800000;
      auVar329._12_4_ = 0x7f800000;
      auVar329._16_4_ = 0x7f800000;
      auVar329._20_4_ = 0x7f800000;
      auVar329._24_4_ = 0x7f800000;
      auVar329._28_4_ = 0x7f800000;
      auVar106 = vblendvps_avx(auVar56,auVar329,auVar106);
      auVar393 = vmaxps_avx(local_300,auVar320);
      auVar393 = vmaxps_avx(auVar393,auVar265);
      auVar35 = vminps_avx(auVar394,auVar106);
      auVar394 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar265 = vsubps_avx(auVar394,auVar147);
      auVar106 = vsubps_avx(auVar394,_local_a80);
      auVar57._4_4_ = auVar106._4_4_ * -fVar382;
      auVar57._0_4_ = auVar106._0_4_ * -fVar375;
      auVar57._8_4_ = auVar106._8_4_ * -fVar383;
      auVar57._12_4_ = auVar106._12_4_ * -fVar384;
      auVar57._16_4_ = auVar106._16_4_ * -fVar385;
      auVar57._20_4_ = auVar106._20_4_ * -fVar386;
      auVar57._24_4_ = auVar106._24_4_ * -fVar387;
      auVar57._28_4_ = auVar106._28_4_;
      auVar58._4_4_ = fVar227 * auVar265._4_4_;
      auVar58._0_4_ = fVar178 * auVar265._0_4_;
      auVar58._8_4_ = fVar205 * auVar265._8_4_;
      auVar58._12_4_ = fVar233 * auVar265._12_4_;
      auVar58._16_4_ = fVar258 * auVar265._16_4_;
      auVar58._20_4_ = fVar362 * auVar265._20_4_;
      auVar58._24_4_ = fVar25 * auVar265._24_4_;
      auVar58._28_4_ = auVar265._28_4_;
      auVar265 = vsubps_avx(auVar57,auVar58);
      auVar106 = vsubps_avx(auVar394,auVar195);
      auVar59._4_4_ = fVar232 * auVar106._4_4_;
      auVar59._0_4_ = fVar199 * auVar106._0_4_;
      auVar59._8_4_ = fVar224 * auVar106._8_4_;
      auVar59._12_4_ = fVar249 * auVar106._12_4_;
      auVar59._16_4_ = fVar274 * auVar106._16_4_;
      auVar59._20_4_ = fVar374 * auVar106._20_4_;
      uVar9 = auVar106._28_4_;
      auVar59._24_4_ = fVar26 * auVar106._24_4_;
      auVar59._28_4_ = uVar9;
      auVar147 = vsubps_avx(auVar265,auVar59);
      auVar60._4_4_ = (float)local_7c0._4_4_ * -fVar382;
      auVar60._0_4_ = (float)local_7c0._0_4_ * -fVar375;
      auVar60._8_4_ = fStack_7b8 * -fVar383;
      auVar60._12_4_ = fStack_7b4 * -fVar384;
      auVar60._16_4_ = fStack_7b0 * -fVar385;
      auVar60._20_4_ = fStack_7ac * -fVar386;
      auVar60._24_4_ = fStack_7a8 * -fVar387;
      auVar60._28_4_ = uVar81 ^ 0x80000000;
      auVar61._4_4_ = (float)local_820._4_4_ * fVar227;
      auVar61._0_4_ = (float)local_820._0_4_ * fVar178;
      auVar61._8_4_ = fStack_818 * fVar205;
      auVar61._12_4_ = fStack_814 * fVar233;
      auVar61._16_4_ = fStack_810 * fVar258;
      auVar61._20_4_ = fStack_80c * fVar362;
      auVar61._24_4_ = fStack_808 * fVar25;
      auVar61._28_4_ = uVar9;
      auVar265 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar232 * (float)local_800._4_4_;
      auVar62._0_4_ = fVar199 * (float)local_800._0_4_;
      auVar62._8_4_ = fVar224 * fStack_7f8;
      auVar62._12_4_ = fVar249 * fStack_7f4;
      auVar62._16_4_ = fVar274 * fStack_7f0;
      auVar62._20_4_ = fVar374 * fStack_7ec;
      auVar62._24_4_ = fVar26 * fStack_7e8;
      auVar62._28_4_ = uVar9;
      auVar195 = vsubps_avx(auVar265,auVar62);
      auVar265 = vrcpps_avx(auVar195);
      fVar178 = auVar265._0_4_;
      fVar199 = auVar265._4_4_;
      auVar63._4_4_ = auVar195._4_4_ * fVar199;
      auVar63._0_4_ = auVar195._0_4_ * fVar178;
      fVar200 = auVar265._8_4_;
      auVar63._8_4_ = auVar195._8_4_ * fVar200;
      fVar201 = auVar265._12_4_;
      auVar63._12_4_ = auVar195._12_4_ * fVar201;
      fVar204 = auVar265._16_4_;
      auVar63._16_4_ = auVar195._16_4_ * fVar204;
      fVar227 = auVar265._20_4_;
      auVar63._20_4_ = auVar195._20_4_ * fVar227;
      fVar232 = auVar265._24_4_;
      auVar63._24_4_ = auVar195._24_4_ * fVar232;
      auVar63._28_4_ = fStack_7e4;
      auVar394 = vsubps_avx(auVar380,auVar63);
      auVar265 = vandps_avx(auVar195,auVar300);
      auVar301._8_4_ = 0x219392ef;
      auVar301._0_8_ = 0x219392ef219392ef;
      auVar301._12_4_ = 0x219392ef;
      auVar301._16_4_ = 0x219392ef;
      auVar301._20_4_ = 0x219392ef;
      auVar301._24_4_ = 0x219392ef;
      auVar301._28_4_ = 0x219392ef;
      auVar106 = vcmpps_avx(auVar265,auVar301,1);
      auVar64._4_4_ = (fVar199 + fVar199 * auVar394._4_4_) * -auVar147._4_4_;
      auVar64._0_4_ = (fVar178 + fVar178 * auVar394._0_4_) * -auVar147._0_4_;
      auVar64._8_4_ = (fVar200 + fVar200 * auVar394._8_4_) * -auVar147._8_4_;
      auVar64._12_4_ = (fVar201 + fVar201 * auVar394._12_4_) * -auVar147._12_4_;
      auVar64._16_4_ = (fVar204 + fVar204 * auVar394._16_4_) * -auVar147._16_4_;
      auVar64._20_4_ = (fVar227 + fVar227 * auVar394._20_4_) * -auVar147._20_4_;
      auVar64._24_4_ = (fVar232 + fVar232 * auVar394._24_4_) * -auVar147._24_4_;
      auVar64._28_4_ = auVar147._28_4_ ^ 0x80000000;
      auVar265 = vcmpps_avx(auVar195,ZEXT832(0) << 0x20,1);
      auVar265 = vorps_avx(auVar106,auVar265);
      auVar265 = vblendvps_avx(auVar64,auVar324,auVar265);
      _local_a40 = vmaxps_avx(auVar393,auVar265);
      auVar265 = vcmpps_avx(auVar195,ZEXT832(0) << 0x20,6);
      auVar265 = vorps_avx(auVar106,auVar265);
      auVar265 = vblendvps_avx(auVar64,auVar329,auVar265);
      auVar105 = vandps_avx(auVar105,local_400);
      local_380 = vminps_avx(auVar35,auVar265);
      auVar265 = vcmpps_avx(_local_a40,local_380,2);
      auVar106 = auVar105 & auVar265;
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0x7f,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0xbf,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar106[0x1f] < '\0') {
        auVar106 = vminps_avx(local_7a0,auVar107);
        auVar147 = vminps_avx(auVar168,auVar34);
        auVar106 = vminps_avx(auVar106,auVar147);
        auVar106 = vsubps_avx(auVar106,auVar318);
        auVar105 = vandps_avx(auVar265,auVar105);
        auVar265 = vminps_avx(_local_960,auVar380);
        auVar265 = vmaxps_avx(auVar265,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar88 + fVar130 * (auVar265._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar120 + fVar155 * (auVar265._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar122 + fVar156 * (auVar265._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar124 + fVar157 * (auVar265._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar88 + fVar130 * (auVar265._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar120 + fVar155 * (auVar265._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar122 + fVar156 * (auVar265._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar124 + auVar265._28_4_ + 7.0;
        auVar76._4_4_ = fStack_31c;
        auVar76._0_4_ = local_320;
        auVar76._8_4_ = fStack_318;
        auVar76._12_4_ = fStack_314;
        auVar76._16_4_ = fStack_310;
        auVar76._20_4_ = fStack_30c;
        auVar76._24_4_ = fStack_308;
        auVar76._28_4_ = fStack_304;
        auVar265 = vminps_avx(auVar76,auVar380);
        auVar265 = vmaxps_avx(auVar265,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar88 + fVar130 * (auVar265._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar120 + fVar155 * (auVar265._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar122 + fVar156 * (auVar265._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar124 + fVar157 * (auVar265._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar88 + fVar130 * (auVar265._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar120 + fVar155 * (auVar265._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar122 + fVar156 * (auVar265._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar124 + auVar265._28_4_ + 7.0;
        auVar65._4_4_ = auVar106._4_4_ * 0.99999976;
        auVar65._0_4_ = auVar106._0_4_ * 0.99999976;
        auVar65._8_4_ = auVar106._8_4_ * 0.99999976;
        auVar65._12_4_ = auVar106._12_4_ * 0.99999976;
        auVar65._16_4_ = auVar106._16_4_ * 0.99999976;
        auVar65._20_4_ = auVar106._20_4_ * 0.99999976;
        auVar65._24_4_ = auVar106._24_4_ * 0.99999976;
        auVar65._28_4_ = 0x3f7ffffc;
        auVar265 = vmaxps_avx(ZEXT832(0) << 0x20,auVar65);
        auVar66._4_4_ = auVar265._4_4_ * auVar265._4_4_;
        auVar66._0_4_ = auVar265._0_4_ * auVar265._0_4_;
        auVar66._8_4_ = auVar265._8_4_ * auVar265._8_4_;
        auVar66._12_4_ = auVar265._12_4_ * auVar265._12_4_;
        auVar66._16_4_ = auVar265._16_4_ * auVar265._16_4_;
        auVar66._20_4_ = auVar265._20_4_ * auVar265._20_4_;
        auVar66._24_4_ = auVar265._24_4_ * auVar265._24_4_;
        auVar66._28_4_ = auVar265._28_4_;
        local_8a0 = vsubps_avx(auVar37,auVar66);
        auVar67._4_4_ = local_8a0._4_4_ * fVar126 * 4.0;
        auVar67._0_4_ = local_8a0._0_4_ * fVar125 * 4.0;
        auVar67._8_4_ = local_8a0._8_4_ * fStack_8d8;
        auVar67._12_4_ = local_8a0._12_4_ * fStack_8d4;
        auVar67._16_4_ = local_8a0._16_4_ * fStack_8d0;
        auVar67._20_4_ = local_8a0._20_4_ * fStack_8cc;
        auVar67._24_4_ = local_8a0._24_4_ * fStack_8c8;
        auVar67._28_4_ = auVar265._28_4_;
        auVar106 = vsubps_avx(auVar49,auVar67);
        auVar265 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,5);
        if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar265 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar265 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar265 >> 0x7f,0) == '\0') &&
              (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar265 >> 0xbf,0) == '\0') &&
            (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar265[0x1f]) {
          auVar168 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_860 = ZEXT832(0) << 0x20;
          _local_6e0 = ZEXT832(0) << 0x20;
          auVar217 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar269._8_4_ = 0xff800000;
          auVar269._0_8_ = 0xff800000ff800000;
          auVar269._12_4_ = 0xff800000;
          auVar269._16_4_ = 0xff800000;
          auVar269._20_4_ = 0xff800000;
          auVar269._24_4_ = 0xff800000;
          auVar269._28_4_ = 0xff800000;
          fVar257 = 0.0;
          fVar89 = 0.0;
          fVar90 = 0.0;
          fVar178 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          fVar204 = 0.0;
          local_8a0 = auVar40;
          _local_840 = _local_860;
        }
        else {
          auVar168 = vsqrtps_avx(auVar106);
          auVar196._0_4_ = fVar125 + fVar125;
          auVar196._4_4_ = fVar126 + fVar126;
          auVar196._8_4_ = fVar127 + fVar127;
          auVar196._12_4_ = fVar128 + fVar128;
          auVar196._16_4_ = fVar334 + fVar334;
          auVar196._20_4_ = fVar336 + fVar336;
          auVar196._24_4_ = fVar338 + fVar338;
          auVar196._28_4_ = fVar257 + fVar257;
          auVar147 = vrcpps_avx(auVar196);
          fVar257 = auVar147._0_4_;
          fVar178 = auVar147._4_4_;
          auVar68._4_4_ = auVar196._4_4_ * fVar178;
          auVar68._0_4_ = auVar196._0_4_ * fVar257;
          fVar199 = auVar147._8_4_;
          auVar68._8_4_ = auVar196._8_4_ * fVar199;
          fVar200 = auVar147._12_4_;
          auVar68._12_4_ = auVar196._12_4_ * fVar200;
          fVar201 = auVar147._16_4_;
          auVar68._16_4_ = auVar196._16_4_ * fVar201;
          fVar204 = auVar147._20_4_;
          auVar68._20_4_ = auVar196._20_4_ * fVar204;
          fVar227 = auVar147._24_4_;
          auVar68._24_4_ = auVar196._24_4_ * fVar227;
          auVar68._28_4_ = auVar196._28_4_;
          auVar195 = vsubps_avx(auVar380,auVar68);
          fVar257 = fVar257 + fVar257 * auVar195._0_4_;
          fVar178 = fVar178 + fVar178 * auVar195._4_4_;
          fVar199 = fVar199 + fVar199 * auVar195._8_4_;
          fVar200 = fVar200 + fVar200 * auVar195._12_4_;
          fVar201 = fVar201 + fVar201 * auVar195._16_4_;
          fVar204 = fVar204 + fVar204 * auVar195._20_4_;
          fVar227 = fVar227 + fVar227 * auVar195._24_4_;
          fVar232 = auVar147._28_4_ + auVar195._28_4_;
          auVar219._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
          auVar219._8_4_ = -local_900._8_4_;
          auVar219._12_4_ = -local_900._12_4_;
          auVar219._16_4_ = -local_900._16_4_;
          auVar219._20_4_ = -local_900._20_4_;
          auVar219._24_4_ = -local_900._24_4_;
          auVar219._28_4_ = -local_900._28_4_;
          auVar147 = vsubps_avx(auVar219,auVar168);
          fVar248 = auVar147._0_4_ * fVar257;
          fVar250 = auVar147._4_4_ * fVar178;
          auVar69._4_4_ = fVar250;
          auVar69._0_4_ = fVar248;
          fVar252 = auVar147._8_4_ * fVar199;
          auVar69._8_4_ = fVar252;
          fVar205 = auVar147._12_4_ * fVar200;
          auVar69._12_4_ = fVar205;
          fVar224 = auVar147._16_4_ * fVar201;
          auVar69._16_4_ = fVar224;
          fVar226 = auVar147._20_4_ * fVar204;
          auVar69._20_4_ = fVar226;
          fVar228 = auVar147._24_4_ * fVar227;
          auVar69._24_4_ = fVar228;
          auVar69._28_4_ = local_940._28_4_;
          auVar168 = vsubps_avx(auVar168,local_900);
          auVar366._0_4_ = auVar168._0_4_ * fVar257;
          auVar366._4_4_ = auVar168._4_4_ * fVar178;
          auVar366._8_4_ = auVar168._8_4_ * fVar199;
          auVar366._12_4_ = auVar168._12_4_ * fVar200;
          auVar366._16_4_ = auVar168._16_4_ * fVar201;
          auVar366._20_4_ = auVar168._20_4_ * fVar204;
          auVar366._24_4_ = auVar168._24_4_ * fVar227;
          auVar366._28_4_ = 0;
          fVar257 = local_340 * (fVar248 * fVar326 + fVar339);
          fVar178 = fStack_33c * (fVar250 * fVar330 + fVar345);
          fVar199 = fStack_338 * (fVar252 * fVar331 + fVar346);
          fVar200 = fStack_334 * (fVar205 * fVar332 + fVar347);
          fVar201 = fStack_330 * (fVar224 * fVar333 + fVar348);
          fVar204 = fStack_32c * (fVar226 * fVar335 + fVar349);
          fVar227 = fStack_328 * (fVar228 * fVar337 + fVar350);
          auStack_690._12_4_ = auVar218._28_4_;
          auVar169._0_4_ = auVar377._0_4_ + fVar90 * fVar257;
          auVar169._4_4_ = auVar377._4_4_ + fVar225 * fVar178;
          auVar169._8_4_ = auVar377._8_4_ + fVar203 * fVar199;
          auVar169._12_4_ = auVar377._12_4_ + fVar231 * fVar200;
          auVar169._16_4_ = auVar377._16_4_ + fVar256 * fVar201;
          auVar169._20_4_ = auVar377._20_4_ + fVar289 * fVar204;
          auVar169._24_4_ = auVar377._24_4_ + fVar24 * fVar227;
          auVar169._28_4_ = auVar377._28_4_ + auVar168._28_4_ + fVar351;
          auVar70._4_4_ = fVar250 * (float)local_800._4_4_;
          auVar70._0_4_ = fVar248 * (float)local_800._0_4_;
          auVar70._8_4_ = fVar252 * fStack_7f8;
          auVar70._12_4_ = fVar205 * fStack_7f4;
          auVar70._16_4_ = fVar224 * fStack_7f0;
          auVar70._20_4_ = fVar226 * fStack_7ec;
          auVar70._24_4_ = fVar228 * fStack_7e8;
          auVar70._28_4_ = fVar232;
          _local_a80 = vsubps_avx(auVar70,auVar169);
          auVar197._0_4_ = auVar389._0_4_ + fVar89 * fVar257;
          auVar197._4_4_ = auVar389._4_4_ + fVar223 * fVar178;
          auVar197._8_4_ = auVar389._8_4_ + fVar202 * fVar199;
          auVar197._12_4_ = auVar389._12_4_ + fVar230 * fVar200;
          auVar197._16_4_ = auVar389._16_4_ + fVar255 * fVar201;
          auVar197._20_4_ = auVar389._20_4_ + fVar286 * fVar204;
          auVar197._24_4_ = auVar389._24_4_ + fVar23 * fVar227;
          auVar197._28_4_ = auVar389._28_4_ + fVar232;
          auVar244._0_4_ = (float)local_820._0_4_ * fVar248;
          auVar244._4_4_ = (float)local_820._4_4_ * fVar250;
          auVar244._8_4_ = fStack_818 * fVar252;
          auVar244._12_4_ = fStack_814 * fVar205;
          auVar244._16_4_ = fStack_810 * fVar224;
          auVar244._20_4_ = fStack_80c * fVar226;
          auVar244._24_4_ = fStack_808 * fVar228;
          auVar244._28_4_ = 0;
          auVar168 = vsubps_avx(auVar244,auVar197);
          auVar220._0_4_ = auVar397._0_4_ + fVar352 * fVar257;
          auVar220._4_4_ = auVar397._4_4_ + fVar356 * fVar178;
          auVar220._8_4_ = auVar397._8_4_ + fVar357 * fVar199;
          auVar220._12_4_ = auVar397._12_4_ + fVar358 * fVar200;
          auVar220._16_4_ = auVar397._16_4_ + fVar359 * fVar201;
          auVar220._20_4_ = auVar397._20_4_ + fVar360 * fVar204;
          auVar220._24_4_ = auVar397._24_4_ + fVar361 * fVar227;
          auVar220._28_4_ = auVar397._28_4_ + auVar147._28_4_;
          auVar71._4_4_ = (float)local_7c0._4_4_ * fVar250;
          auVar71._0_4_ = (float)local_7c0._0_4_ * fVar248;
          auVar71._8_4_ = fStack_7b8 * fVar252;
          auVar71._12_4_ = fStack_7b4 * fVar205;
          auVar71._16_4_ = fStack_7b0 * fVar224;
          auVar71._20_4_ = fStack_7ac * fVar226;
          auVar71._24_4_ = fStack_7a8 * fVar228;
          auVar71._28_4_ = 0;
          auVar147 = vsubps_avx(auVar71,auVar220);
          auVar217 = auVar147._0_28_;
          fVar257 = local_340 * (auVar366._0_4_ * fVar326 + fVar339);
          fVar178 = fStack_33c * (auVar366._4_4_ * fVar330 + fVar345);
          fVar199 = fStack_338 * (auVar366._8_4_ * fVar331 + fVar346);
          fVar200 = fStack_334 * (auVar366._12_4_ * fVar332 + fVar347);
          fVar201 = fStack_330 * (auVar366._16_4_ * fVar333 + fVar348);
          fVar204 = fStack_32c * (auVar366._20_4_ * fVar335 + fVar349);
          fVar227 = fStack_328 * (auVar366._24_4_ * fVar337 + fVar350);
          auVar270._0_4_ = auVar377._0_4_ + fVar90 * fVar257;
          auVar270._4_4_ = auVar377._4_4_ + fVar225 * fVar178;
          auVar270._8_4_ = auVar377._8_4_ + fVar203 * fVar199;
          auVar270._12_4_ = auVar377._12_4_ + fVar231 * fVar200;
          auVar270._16_4_ = auVar377._16_4_ + fVar256 * fVar201;
          auVar270._20_4_ = auVar377._20_4_ + fVar289 * fVar204;
          auVar270._24_4_ = auVar377._24_4_ + fVar24 * fVar227;
          auVar270._28_4_ = auVar377._28_4_ + (float)auStack_690._12_4_;
          auVar72._4_4_ = auVar366._4_4_ * (float)local_800._4_4_;
          auVar72._0_4_ = auVar366._0_4_ * (float)local_800._0_4_;
          auVar72._8_4_ = auVar366._8_4_ * fStack_7f8;
          auVar72._12_4_ = auVar366._12_4_ * fStack_7f4;
          auVar72._16_4_ = auVar366._16_4_ * fStack_7f0;
          auVar72._20_4_ = auVar366._20_4_ * fStack_7ec;
          auVar72._24_4_ = auVar366._24_4_ * fStack_7e8;
          auVar72._28_4_ = fStack_7e4;
          _local_840 = vsubps_avx(auVar72,auVar270);
          auVar271._0_4_ = auVar389._0_4_ + fVar89 * fVar257;
          auVar271._4_4_ = auVar389._4_4_ + fVar223 * fVar178;
          auVar271._8_4_ = auVar389._8_4_ + fVar202 * fVar199;
          auVar271._12_4_ = auVar389._12_4_ + fVar230 * fVar200;
          auVar271._16_4_ = auVar389._16_4_ + fVar255 * fVar201;
          auVar271._20_4_ = auVar389._20_4_ + fVar286 * fVar204;
          auVar271._24_4_ = auVar389._24_4_ + fVar23 * fVar227;
          auVar271._28_4_ = auVar389._28_4_ + local_840._28_4_;
          auVar73._4_4_ = (float)local_820._4_4_ * auVar366._4_4_;
          auVar73._0_4_ = (float)local_820._0_4_ * auVar366._0_4_;
          auVar73._8_4_ = fStack_818 * auVar366._8_4_;
          auVar73._12_4_ = fStack_814 * auVar366._12_4_;
          auVar73._16_4_ = fStack_810 * auVar366._16_4_;
          auVar73._20_4_ = fStack_80c * auVar366._20_4_;
          auVar73._24_4_ = fStack_808 * auVar366._24_4_;
          auVar73._28_4_ = fStack_7e4;
          _local_860 = vsubps_avx(auVar73,auVar271);
          auVar245._0_4_ = auVar397._0_4_ + fVar352 * fVar257;
          auVar245._4_4_ = auVar397._4_4_ + fVar356 * fVar178;
          auVar245._8_4_ = auVar397._8_4_ + fVar357 * fVar199;
          auVar245._12_4_ = auVar397._12_4_ + fVar358 * fVar200;
          auVar245._16_4_ = auVar397._16_4_ + fVar359 * fVar201;
          auVar245._20_4_ = auVar397._20_4_ + fVar360 * fVar204;
          auVar245._24_4_ = auVar397._24_4_ + fVar361 * fVar227;
          auVar245._28_4_ = auVar397._28_4_ + fVar351 + 0.0;
          auVar74._4_4_ = (float)local_7c0._4_4_ * auVar366._4_4_;
          auVar74._0_4_ = (float)local_7c0._0_4_ * auVar366._0_4_;
          auVar74._8_4_ = fStack_7b8 * auVar366._8_4_;
          auVar74._12_4_ = fStack_7b4 * auVar366._12_4_;
          auVar74._16_4_ = fStack_7b0 * auVar366._16_4_;
          auVar74._20_4_ = fStack_7ac * auVar366._20_4_;
          auVar74._24_4_ = fStack_7a8 * auVar366._24_4_;
          auVar74._28_4_ = local_860._28_4_;
          _local_6e0 = vsubps_avx(auVar74,auVar245);
          auVar147 = vcmpps_avx(auVar106,_DAT_01faff00,5);
          auVar246._8_4_ = 0x7f800000;
          auVar246._0_8_ = 0x7f8000007f800000;
          auVar246._12_4_ = 0x7f800000;
          auVar246._16_4_ = 0x7f800000;
          auVar246._20_4_ = 0x7f800000;
          auVar246._24_4_ = 0x7f800000;
          auVar246._28_4_ = 0x7f800000;
          auVar243 = vblendvps_avx(auVar246,auVar69,auVar147);
          auVar343._8_4_ = 0x7fffffff;
          auVar343._0_8_ = 0x7fffffff7fffffff;
          auVar343._12_4_ = 0x7fffffff;
          auVar343._16_4_ = 0x7fffffff;
          auVar343._20_4_ = 0x7fffffff;
          auVar343._24_4_ = 0x7fffffff;
          auVar343._28_4_ = 0x7fffffff;
          auVar106 = vandps_avx(auVar343,local_360);
          auVar106 = vmaxps_avx(local_440,auVar106);
          auVar75._4_4_ = auVar106._4_4_ * 1.9073486e-06;
          auVar75._0_4_ = auVar106._0_4_ * 1.9073486e-06;
          auVar75._8_4_ = auVar106._8_4_ * 1.9073486e-06;
          auVar75._12_4_ = auVar106._12_4_ * 1.9073486e-06;
          auVar75._16_4_ = auVar106._16_4_ * 1.9073486e-06;
          auVar75._20_4_ = auVar106._20_4_ * 1.9073486e-06;
          auVar75._24_4_ = auVar106._24_4_ * 1.9073486e-06;
          auVar75._28_4_ = auVar106._28_4_;
          auVar106 = vandps_avx(auVar343,local_4a0);
          auVar106 = vcmpps_avx(auVar106,auVar75,1);
          auVar272._8_4_ = 0xff800000;
          auVar272._0_8_ = 0xff800000ff800000;
          auVar272._12_4_ = 0xff800000;
          auVar272._16_4_ = 0xff800000;
          auVar272._20_4_ = 0xff800000;
          auVar272._24_4_ = 0xff800000;
          auVar272._28_4_ = 0xff800000;
          auVar269 = vblendvps_avx(auVar272,auVar366,auVar147);
          auVar195 = auVar147 & auVar106;
          if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar195 >> 0x7f,0) != '\0') ||
                (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar195 >> 0xbf,0) != '\0') ||
              (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar195[0x1f] < '\0') {
            auVar265 = vandps_avx(auVar106,auVar147);
            auVar235 = vpackssdw_avx(auVar265._0_16_,auVar265._16_16_);
            auVar195 = vcmpps_avx(local_8a0,ZEXT832(0) << 0x20,2);
            auVar395._8_4_ = 0xff800000;
            auVar395._0_8_ = 0xff800000ff800000;
            auVar395._12_4_ = 0xff800000;
            auVar395._16_4_ = 0xff800000;
            auVar395._20_4_ = 0xff800000;
            auVar395._24_4_ = 0xff800000;
            auVar395._28_4_ = 0xff800000;
            auVar399._8_4_ = 0x7f800000;
            auVar399._0_8_ = 0x7f8000007f800000;
            auVar399._12_4_ = 0x7f800000;
            auVar399._16_4_ = 0x7f800000;
            auVar399._20_4_ = 0x7f800000;
            auVar399._24_4_ = 0x7f800000;
            auVar399._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar399,auVar395,auVar195);
            auVar97 = vpmovsxwd_avx(auVar235);
            auVar235 = vpunpckhwd_avx(auVar235,auVar235);
            auVar344._16_16_ = auVar235;
            auVar344._0_16_ = auVar97;
            auVar243 = vblendvps_avx(auVar243,auVar106,auVar344);
            auVar106 = vblendvps_avx(auVar395,auVar399,auVar195);
            auVar269 = vblendvps_avx(auVar269,auVar106,auVar344);
            auVar106 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar119._0_4_ = auVar106._0_4_ ^ auVar265._0_4_;
            auVar119._4_4_ = auVar106._4_4_ ^ auVar265._4_4_;
            auVar119._8_4_ = auVar106._8_4_ ^ auVar265._8_4_;
            auVar119._12_4_ = auVar106._12_4_ ^ auVar265._12_4_;
            auVar119._16_4_ = auVar106._16_4_ ^ auVar265._16_4_;
            auVar119._20_4_ = auVar106._20_4_ ^ auVar265._20_4_;
            auVar119._24_4_ = auVar106._24_4_ ^ auVar265._24_4_;
            auVar119._28_4_ = auVar106._28_4_ ^ auVar265._28_4_;
            auVar265 = vorps_avx(auVar195,auVar119);
            auVar265 = vandps_avx(auVar147,auVar265);
          }
          fVar257 = (float)local_a80._0_4_;
          fVar89 = (float)local_a80._4_4_;
          fVar90 = fStack_a78;
          fVar178 = fStack_a74;
          fVar199 = fStack_a70;
          fVar200 = fStack_a6c;
          fVar201 = fStack_a68;
          fVar204 = fStack_a64;
          _local_aa0 = auVar168;
        }
        _local_3e0 = _local_a40;
        local_3c0 = vminps_avx(local_380,auVar243);
        _local_720 = vmaxps_avx(_local_a40,auVar269);
        local_3a0 = _local_720;
        auVar106 = vcmpps_avx(_local_a40,local_3c0,2);
        local_640 = vandps_avx(auVar105,auVar106);
        auVar106 = vcmpps_avx(_local_720,local_380,2);
        auVar105 = vandps_avx(auVar105,auVar106);
        auVar106 = vorps_avx(auVar105,local_640);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          _local_960 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_660._0_4_ = auVar265._0_4_ ^ local_960._0_4_;
          local_660._4_4_ = auVar265._4_4_ ^ local_960._4_4_;
          local_660._8_4_ = auVar265._8_4_ ^ local_960._8_4_;
          local_660._12_4_ = auVar265._12_4_ ^ local_960._12_4_;
          local_660._16_4_ = auVar265._16_4_ ^ local_960._16_4_;
          local_660._20_4_ = auVar265._20_4_ ^ local_960._20_4_;
          local_660._24_4_ = auVar265._24_4_ ^ local_960._24_4_;
          local_660._28_4_ = auVar265._28_4_ ^ (uint)local_960._28_4_;
          auVar110._0_4_ =
               fVar257 * (float)local_800._0_4_ +
               auVar168._0_4_ * (float)local_820._0_4_ + (float)local_7c0._0_4_ * auVar217._0_4_;
          auVar110._4_4_ =
               fVar89 * (float)local_800._4_4_ +
               auVar168._4_4_ * (float)local_820._4_4_ + (float)local_7c0._4_4_ * auVar217._4_4_;
          auVar110._8_4_ =
               fVar90 * fStack_7f8 + auVar168._8_4_ * fStack_818 + fStack_7b8 * auVar217._8_4_;
          auVar110._12_4_ =
               fVar178 * fStack_7f4 + auVar168._12_4_ * fStack_814 + fStack_7b4 * auVar217._12_4_;
          auVar110._16_4_ =
               fVar199 * fStack_7f0 + auVar168._16_4_ * fStack_810 + fStack_7b0 * auVar217._16_4_;
          auVar110._20_4_ =
               fVar200 * fStack_7ec + auVar168._20_4_ * fStack_80c + fStack_7ac * auVar217._20_4_;
          auVar110._24_4_ =
               fVar201 * fStack_7e8 + auVar168._24_4_ * fStack_808 + fStack_7a8 * auVar217._24_4_;
          auVar110._28_4_ = fVar204 + local_960._28_4_ + auVar168._28_4_;
          auVar150._8_4_ = 0x7fffffff;
          auVar150._0_8_ = 0x7fffffff7fffffff;
          auVar150._12_4_ = 0x7fffffff;
          auVar150._16_4_ = 0x7fffffff;
          auVar150._20_4_ = 0x7fffffff;
          auVar150._24_4_ = 0x7fffffff;
          auVar150._28_4_ = 0x7fffffff;
          auVar265 = vandps_avx(auVar110,auVar150);
          auVar151._8_4_ = 0x3e99999a;
          auVar151._0_8_ = 0x3e99999a3e99999a;
          auVar151._12_4_ = 0x3e99999a;
          auVar151._16_4_ = 0x3e99999a;
          auVar151._20_4_ = 0x3e99999a;
          auVar151._24_4_ = 0x3e99999a;
          auVar151._28_4_ = 0x3e99999a;
          auVar265 = vcmpps_avx(auVar265,auVar151,1);
          auVar265 = vorps_avx(auVar265,local_660);
          auVar152._8_4_ = 3;
          auVar152._0_8_ = 0x300000003;
          auVar152._12_4_ = 3;
          auVar152._16_4_ = 3;
          auVar152._20_4_ = 3;
          auVar152._24_4_ = 3;
          auVar152._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar265 = vblendvps_avx(auVar170,auVar152,auVar265);
          local_680 = ZEXT432(local_c88);
          local_6a0 = vpshufd_avx(ZEXT416(local_c88),0);
          auVar235 = vpcmpgtd_avx(auVar265._16_16_,local_6a0);
          auStack_690 = auVar218._16_16_;
          auVar97 = vpcmpgtd_avx(auVar265._0_16_,local_6a0);
          auVar153._16_16_ = auVar235;
          auVar153._0_16_ = auVar97;
          local_700 = vblendps_avx(ZEXT1632(auVar97),auVar153,0xf0);
          local_600 = vandnps_avx(local_700,local_640);
          auVar325 = ZEXT3264(local_600);
          auVar265 = local_640 & ~local_700;
          auVar273 = ZEXT3264(local_a60);
          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar265 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar265 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar265 >> 0x7f,0) == '\0') &&
                (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar265 >> 0xbf,0) == '\0') &&
              (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar265[0x1f]) {
            auVar235 = vshufps_avx(auVar136,auVar136,0);
            auVar111._16_16_ = auVar235;
            auVar111._0_16_ = auVar235;
            auVar217 = local_800._0_28_;
          }
          else {
            local_7e0._4_4_ = (float)local_a40._4_4_ + local_8c0._4_4_;
            local_7e0._0_4_ = (float)local_a40._0_4_ + (float)local_8c0;
            fStack_7d8 = fStack_a38 + (float)uStack_8b8;
            fStack_7d4 = fStack_a34 + uStack_8b8._4_4_;
            fStack_7d0 = fStack_a30 + (float)uStack_8b0;
            fStack_7cc = fStack_a2c + uStack_8b0._4_4_;
            fStack_7c8 = fStack_a28 + (float)uStack_8a8;
            fStack_7c4 = fStack_a24 + uStack_8a8._4_4_;
            local_6c0 = auVar105;
            do {
              auVar112._8_4_ = 0x7f800000;
              auVar112._0_8_ = 0x7f8000007f800000;
              auVar112._12_4_ = 0x7f800000;
              auVar112._16_4_ = 0x7f800000;
              auVar112._20_4_ = 0x7f800000;
              auVar112._24_4_ = 0x7f800000;
              auVar112._28_4_ = 0x7f800000;
              auVar105 = auVar325._0_32_;
              auVar265 = vblendvps_avx(auVar112,_local_a40,auVar105);
              auVar106 = vshufps_avx(auVar265,auVar265,0xb1);
              auVar106 = vminps_avx(auVar265,auVar106);
              auVar147 = vshufpd_avx(auVar106,auVar106,5);
              auVar106 = vminps_avx(auVar106,auVar147);
              auVar147 = vperm2f128_avx(auVar106,auVar106,1);
              auVar106 = vminps_avx(auVar106,auVar147);
              auVar265 = vcmpps_avx(auVar265,auVar106,0);
              auVar106 = auVar105 & auVar265;
              if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar106 >> 0x7f,0) != '\0') ||
                    (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar106 >> 0xbf,0) != '\0') ||
                  (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar106[0x1f] < '\0') {
                auVar105 = vandps_avx(auVar265,auVar105);
              }
              uVar78 = vmovmskps_avx(auVar105);
              uVar81 = 0;
              if (uVar78 != 0) {
                for (; (uVar78 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
                }
              }
              uVar80 = (ulong)uVar81;
              *(undefined4 *)(local_600 + uVar80 * 4) = 0;
              fVar257 = local_1a0[uVar80];
              uVar81 = *(uint *)(local_3e0 + uVar80 * 4);
              fVar89 = auVar135._0_4_;
              if ((float)local_920._0_4_ < 0.0) {
                fVar89 = sqrtf((float)local_920._0_4_);
              }
              auVar136 = vminps_avx(_local_ae0,_local_b00);
              auVar235 = vmaxps_avx(_local_ae0,_local_b00);
              auVar97 = vminps_avx(_local_af0,_local_b10);
              auVar101 = vminps_avx(auVar136,auVar97);
              auVar136 = vmaxps_avx(_local_af0,_local_b10);
              auVar97 = vmaxps_avx(auVar235,auVar136);
              auVar182._8_4_ = 0x7fffffff;
              auVar182._0_8_ = 0x7fffffff7fffffff;
              auVar182._12_4_ = 0x7fffffff;
              auVar235 = vandps_avx(auVar101,auVar182);
              auVar136 = vandps_avx(auVar97,auVar182);
              auVar235 = vmaxps_avx(auVar235,auVar136);
              auVar136 = vmovshdup_avx(auVar235);
              auVar136 = vmaxss_avx(auVar136,auVar235);
              auVar235 = vshufpd_avx(auVar235,auVar235,1);
              auVar235 = vmaxss_avx(auVar235,auVar136);
              fVar90 = auVar235._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar89 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
              auVar235 = vinsertps_avx(ZEXT416(uVar81),ZEXT416((uint)fVar257),0x10);
              lVar87 = 5;
              do {
                auVar136 = vmovshdup_avx(auVar235);
                fVar252 = auVar136._0_4_;
                fVar200 = 1.0 - fVar252;
                auVar136 = vshufps_avx(auVar235,auVar235,0x55);
                fVar257 = auVar136._0_4_;
                fVar89 = auVar136._4_4_;
                fVar178 = auVar136._8_4_;
                fVar199 = auVar136._12_4_;
                auVar136 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
                fVar201 = auVar136._0_4_;
                fVar204 = auVar136._4_4_;
                fVar223 = auVar136._8_4_;
                fVar225 = auVar136._12_4_;
                fVar227 = (float)local_af0._0_4_ * fVar257 + (float)local_b00._0_4_ * fVar201;
                fVar232 = (float)local_af0._4_4_ * fVar89 + (float)local_b00._4_4_ * fVar204;
                fVar248 = fStack_ae8 * fVar178 + fStack_af8 * fVar223;
                fVar250 = fStack_ae4 * fVar199 + fStack_af4 * fVar225;
                auVar236._0_4_ =
                     fVar201 * ((float)local_b00._0_4_ * fVar257 + fVar201 * (float)local_ae0._0_4_)
                     + fVar257 * fVar227;
                auVar236._4_4_ =
                     fVar204 * ((float)local_b00._4_4_ * fVar89 + fVar204 * (float)local_ae0._4_4_)
                     + fVar89 * fVar232;
                auVar236._8_4_ =
                     fVar223 * (fStack_af8 * fVar178 + fVar223 * fStack_ad8) + fVar178 * fVar248;
                auVar236._12_4_ =
                     fVar225 * (fStack_af4 * fVar199 + fVar225 * fStack_ad4) + fVar199 * fVar250;
                auVar183._0_4_ =
                     fVar201 * fVar227 +
                     fVar257 * (fVar257 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar201)
                ;
                auVar183._4_4_ =
                     fVar204 * fVar232 +
                     fVar89 * (fVar89 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar204);
                auVar183._8_4_ =
                     fVar223 * fVar248 + fVar178 * (fVar178 * fStack_b08 + fStack_ae8 * fVar223);
                auVar183._12_4_ =
                     fVar225 * fVar250 + fVar199 * (fVar199 * fStack_b04 + fStack_ae4 * fVar225);
                auVar136 = vshufps_avx(auVar235,auVar235,0);
                auVar137._0_4_ = auVar136._0_4_ * (float)local_910._0_4_ + 0.0;
                auVar137._4_4_ = auVar136._4_4_ * (float)local_910._4_4_ + 0.0;
                auVar137._8_4_ = auVar136._8_4_ * fStack_908 + 0.0;
                auVar137._12_4_ = auVar136._12_4_ * fStack_904 + 0.0;
                auVar96._0_4_ = fVar201 * auVar236._0_4_ + fVar257 * auVar183._0_4_;
                auVar96._4_4_ = fVar204 * auVar236._4_4_ + fVar89 * auVar183._4_4_;
                auVar96._8_4_ = fVar223 * auVar236._8_4_ + fVar178 * auVar183._8_4_;
                auVar96._12_4_ = fVar225 * auVar236._12_4_ + fVar199 * auVar183._12_4_;
                local_8a0._0_16_ = auVar96;
                auVar136 = vsubps_avx(auVar137,auVar96);
                _local_aa0 = auVar136;
                auVar136 = vdpps_avx(auVar136,auVar136,0x7f);
                _local_a80 = auVar136;
                if (auVar136._0_4_ < 0.0) {
                  fVar257 = sqrtf(auVar136._0_4_);
                }
                else {
                  auVar136 = vsqrtss_avx(auVar136,auVar136);
                  fVar257 = auVar136._0_4_;
                }
                auVar136 = vsubps_avx(auVar183,auVar236);
                auVar263._0_4_ = auVar136._0_4_ * 3.0;
                auVar263._4_4_ = auVar136._4_4_ * 3.0;
                auVar263._8_4_ = auVar136._8_4_ * 3.0;
                auVar263._12_4_ = auVar136._12_4_ * 3.0;
                auVar136 = vshufps_avx(ZEXT416((uint)(fVar252 * 6.0)),ZEXT416((uint)(fVar252 * 6.0))
                                       ,0);
                auVar97 = ZEXT416((uint)((fVar200 - (fVar252 + fVar252)) * 6.0));
                auVar101 = vshufps_avx(auVar97,auVar97,0);
                auVar97 = ZEXT416((uint)((fVar252 - (fVar200 + fVar200)) * 6.0));
                auVar164 = vshufps_avx(auVar97,auVar97,0);
                auVar190 = vshufps_avx(ZEXT416((uint)(fVar200 * 6.0)),ZEXT416((uint)(fVar200 * 6.0))
                                       ,0);
                auVar97 = vdpps_avx(auVar263,auVar263,0x7f);
                auVar138._0_4_ =
                     auVar190._0_4_ * (float)local_ae0._0_4_ +
                     auVar164._0_4_ * (float)local_b00._0_4_ +
                     auVar136._0_4_ * (float)local_b10._0_4_ +
                     auVar101._0_4_ * (float)local_af0._0_4_;
                auVar138._4_4_ =
                     auVar190._4_4_ * (float)local_ae0._4_4_ +
                     auVar164._4_4_ * (float)local_b00._4_4_ +
                     auVar136._4_4_ * (float)local_b10._4_4_ +
                     auVar101._4_4_ * (float)local_af0._4_4_;
                auVar138._8_4_ =
                     auVar190._8_4_ * fStack_ad8 +
                     auVar164._8_4_ * fStack_af8 +
                     auVar136._8_4_ * fStack_b08 + auVar101._8_4_ * fStack_ae8;
                auVar138._12_4_ =
                     auVar190._12_4_ * fStack_ad4 +
                     auVar164._12_4_ * fStack_af4 +
                     auVar136._12_4_ * fStack_b04 + auVar101._12_4_ * fStack_ae4;
                auVar136 = vblendps_avx(auVar97,_DAT_01f7aa10,0xe);
                auVar101 = vrsqrtss_avx(auVar136,auVar136);
                fVar178 = auVar101._0_4_;
                fVar89 = auVar97._0_4_;
                auVar101 = vdpps_avx(auVar263,auVar138,0x7f);
                auVar164 = vshufps_avx(auVar97,auVar97,0);
                auVar139._0_4_ = auVar138._0_4_ * auVar164._0_4_;
                auVar139._4_4_ = auVar138._4_4_ * auVar164._4_4_;
                auVar139._8_4_ = auVar138._8_4_ * auVar164._8_4_;
                auVar139._12_4_ = auVar138._12_4_ * auVar164._12_4_;
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                auVar209._0_4_ = auVar263._0_4_ * auVar101._0_4_;
                auVar209._4_4_ = auVar263._4_4_ * auVar101._4_4_;
                auVar209._8_4_ = auVar263._8_4_ * auVar101._8_4_;
                auVar209._12_4_ = auVar263._12_4_ * auVar101._12_4_;
                auVar190 = vsubps_avx(auVar139,auVar209);
                auVar101 = vrcpss_avx(auVar136,auVar136);
                auVar136 = vmaxss_avx(ZEXT416((uint)fVar90),
                                      ZEXT416((uint)(auVar235._0_4_ * (float)local_740._0_4_)));
                auVar101 = ZEXT416((uint)(auVar101._0_4_ * (2.0 - fVar89 * auVar101._0_4_)));
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                uVar80 = CONCAT44(auVar263._4_4_,auVar263._0_4_);
                auVar316._0_8_ = uVar80 ^ 0x8000000080000000;
                auVar316._8_4_ = -auVar263._8_4_;
                auVar316._12_4_ = -auVar263._12_4_;
                auVar164 = ZEXT416((uint)(fVar178 * 1.5 +
                                         fVar89 * -0.5 * fVar178 * fVar178 * fVar178));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar184._0_4_ = auVar164._0_4_ * auVar190._0_4_ * auVar101._0_4_;
                auVar184._4_4_ = auVar164._4_4_ * auVar190._4_4_ * auVar101._4_4_;
                auVar184._8_4_ = auVar164._8_4_ * auVar190._8_4_ * auVar101._8_4_;
                auVar184._12_4_ = auVar164._12_4_ * auVar190._12_4_ * auVar101._12_4_;
                local_940._0_4_ = auVar263._0_4_ * auVar164._0_4_;
                local_940._4_4_ = auVar263._4_4_ * auVar164._4_4_;
                local_940._8_4_ = auVar263._8_4_ * auVar164._8_4_;
                local_940._12_4_ = auVar263._12_4_ * auVar164._12_4_;
                if (fVar89 < 0.0) {
                  fVar89 = sqrtf(fVar89);
                }
                else {
                  auVar97 = vsqrtss_avx(auVar97,auVar97);
                  fVar89 = auVar97._0_4_;
                }
                auVar97 = vdpps_avx(_local_aa0,local_940._0_16_,0x7f);
                fVar257 = (fVar90 / fVar89) * (fVar257 + 1.0) + fVar257 * fVar90 + auVar136._0_4_;
                auVar101 = vdpps_avx(auVar316,local_940._0_16_,0x7f);
                auVar164 = vdpps_avx(_local_aa0,auVar184,0x7f);
                auVar190 = vdpps_avx(_local_910,local_940._0_16_,0x7f);
                auVar31 = vdpps_avx(_local_aa0,auVar316,0x7f);
                fVar89 = auVar101._0_4_ + auVar164._0_4_;
                fVar178 = auVar97._0_4_;
                auVar98._0_4_ = fVar178 * fVar178;
                auVar98._4_4_ = auVar97._4_4_ * auVar97._4_4_;
                auVar98._8_4_ = auVar97._8_4_ * auVar97._8_4_;
                auVar98._12_4_ = auVar97._12_4_ * auVar97._12_4_;
                auVar164 = vsubps_avx(_local_a80,auVar98);
                local_940._0_16_ = ZEXT416((uint)fVar89);
                auVar101 = vdpps_avx(_local_aa0,_local_910,0x7f);
                fVar199 = auVar31._0_4_ - fVar178 * fVar89;
                fVar178 = auVar101._0_4_ - fVar178 * auVar190._0_4_;
                auVar101 = vrsqrtss_avx(auVar164,auVar164);
                fVar200 = auVar164._0_4_;
                fVar89 = auVar101._0_4_;
                fVar89 = fVar89 * 1.5 + fVar200 * -0.5 * fVar89 * fVar89 * fVar89;
                if (fVar200 < 0.0) {
                  local_900._0_4_ = fVar199;
                  local_760._0_4_ = fVar178;
                  local_780._0_4_ = fVar89;
                  fVar200 = sqrtf(fVar200);
                  fVar89 = (float)local_780._0_4_;
                  fVar199 = (float)local_900._0_4_;
                  fVar178 = (float)local_760._0_4_;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar164,auVar164);
                  fVar200 = auVar101._0_4_;
                }
                auVar31 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar32 = vshufps_avx(auVar263,auVar263,0xff);
                fVar199 = fVar199 * fVar89 - auVar32._0_4_;
                auVar210._0_8_ = auVar190._0_8_ ^ 0x8000000080000000;
                auVar210._8_4_ = auVar190._8_4_ ^ 0x80000000;
                auVar210._12_4_ = auVar190._12_4_ ^ 0x80000000;
                auVar237._0_4_ = -fVar199;
                auVar237._4_4_ = 0x80000000;
                auVar237._8_4_ = 0x80000000;
                auVar237._12_4_ = 0x80000000;
                auVar101 = vinsertps_avx(auVar237,ZEXT416((uint)(fVar178 * fVar89)),0x1c);
                auVar190 = vmovsldup_avx(ZEXT416((uint)(local_940._0_4_ * fVar178 * fVar89 -
                                                       auVar190._0_4_ * fVar199)));
                auVar101 = vdivps_avx(auVar101,auVar190);
                auVar164 = vinsertps_avx(local_940._0_16_,auVar210,0x10);
                auVar164 = vdivps_avx(auVar164,auVar190);
                auVar190 = vmovsldup_avx(auVar97);
                auVar99 = ZEXT416((uint)(fVar200 - auVar31._0_4_));
                auVar31 = vmovsldup_avx(auVar99);
                auVar162._0_4_ = auVar190._0_4_ * auVar101._0_4_ + auVar31._0_4_ * auVar164._0_4_;
                auVar162._4_4_ = auVar190._4_4_ * auVar101._4_4_ + auVar31._4_4_ * auVar164._4_4_;
                auVar162._8_4_ = auVar190._8_4_ * auVar101._8_4_ + auVar31._8_4_ * auVar164._8_4_;
                auVar162._12_4_ =
                     auVar190._12_4_ * auVar101._12_4_ + auVar31._12_4_ * auVar164._12_4_;
                auVar235 = vsubps_avx(auVar235,auVar162);
                auVar163._8_4_ = 0x7fffffff;
                auVar163._0_8_ = 0x7fffffff7fffffff;
                auVar163._12_4_ = 0x7fffffff;
                auVar97 = vandps_avx(auVar97,auVar163);
                if (auVar97._0_4_ < fVar257) {
                  auVar185._8_4_ = 0x7fffffff;
                  auVar185._0_8_ = 0x7fffffff7fffffff;
                  auVar185._12_4_ = 0x7fffffff;
                  auVar97 = vandps_avx(auVar99,auVar185);
                  if (auVar97._0_4_ <
                      (float)local_7a0._0_4_ * 1.9073486e-06 + fVar257 + auVar136._0_4_) {
                    fVar257 = auVar235._0_4_ + (float)local_880._0_4_;
                    auVar273 = ZEXT3264(local_a60);
                    if ((fVar257 < fVar129) ||
                       (fVar89 = *(float *)(ray + k * 4 + 0x100), fVar89 < fVar257)) break;
                    auVar136 = vmovshdup_avx(auVar235);
                    fVar90 = auVar136._0_4_;
                    if ((fVar90 < 0.0) || (1.0 < fVar90)) break;
                    auVar136 = vrsqrtss_avx(_local_a80,_local_a80);
                    fVar178 = auVar136._0_4_;
                    pGVar12 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar136 = ZEXT416((uint)(fVar178 * 1.5 +
                                             local_a80._0_4_ * -0.5 * fVar178 * fVar178 * fVar178));
                    auVar136 = vshufps_avx(auVar136,auVar136,0);
                    auVar186._0_4_ = auVar136._0_4_ * (float)local_aa0._0_4_;
                    auVar186._4_4_ = auVar136._4_4_ * (float)local_aa0._4_4_;
                    auVar186._8_4_ = auVar136._8_4_ * fStack_a98;
                    auVar186._12_4_ = auVar136._12_4_ * fStack_a94;
                    auVar140._0_4_ = auVar263._0_4_ + auVar32._0_4_ * auVar186._0_4_;
                    auVar140._4_4_ = auVar263._4_4_ + auVar32._4_4_ * auVar186._4_4_;
                    auVar140._8_4_ = auVar263._8_4_ + auVar32._8_4_ * auVar186._8_4_;
                    auVar140._12_4_ = auVar263._12_4_ + auVar32._12_4_ * auVar186._12_4_;
                    auVar136 = vshufps_avx(auVar186,auVar186,0xc9);
                    auVar97 = vshufps_avx(auVar263,auVar263,0xc9);
                    auVar187._0_4_ = auVar97._0_4_ * auVar186._0_4_;
                    auVar187._4_4_ = auVar97._4_4_ * auVar186._4_4_;
                    auVar187._8_4_ = auVar97._8_4_ * auVar186._8_4_;
                    auVar187._12_4_ = auVar97._12_4_ * auVar186._12_4_;
                    auVar211._0_4_ = auVar263._0_4_ * auVar136._0_4_;
                    auVar211._4_4_ = auVar263._4_4_ * auVar136._4_4_;
                    auVar211._8_4_ = auVar263._8_4_ * auVar136._8_4_;
                    auVar211._12_4_ = auVar263._12_4_ * auVar136._12_4_;
                    auVar101 = vsubps_avx(auVar211,auVar187);
                    auVar136 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar97 = vshufps_avx(auVar140,auVar140,0xc9);
                    auVar212._0_4_ = auVar97._0_4_ * auVar136._0_4_;
                    auVar212._4_4_ = auVar97._4_4_ * auVar136._4_4_;
                    auVar212._8_4_ = auVar97._8_4_ * auVar136._8_4_;
                    auVar212._12_4_ = auVar97._12_4_ * auVar136._12_4_;
                    auVar136 = vshufps_avx(auVar101,auVar101,0xd2);
                    auVar141._0_4_ = auVar140._0_4_ * auVar136._0_4_;
                    auVar141._4_4_ = auVar140._4_4_ * auVar136._4_4_;
                    auVar141._8_4_ = auVar140._8_4_ * auVar136._8_4_;
                    auVar141._12_4_ = auVar140._12_4_ * auVar136._12_4_;
                    auVar136 = vsubps_avx(auVar212,auVar141);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar257;
                      uVar9 = vextractps_avx(auVar136,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar136,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar136._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar90;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_8e0;
                      *(uint *)(ray + k * 4 + 0x240) = uVar83;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar18 = context->user;
                    auStack_550 = vshufps_avx(auVar235,auVar235,0x55);
                    auStack_5b0 = vshufps_avx(auVar136,auVar136,0x55);
                    auStack_590 = vshufps_avx(auVar136,auVar136,0xaa);
                    auStack_570 = vshufps_avx(auVar136,auVar136,0);
                    local_5c0 = (RTCHitN  [16])auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = auStack_570;
                    local_560 = auStack_550;
                    local_540 = ZEXT832(0) << 0x20;
                    local_520 = local_480._0_8_;
                    uStack_518 = local_480._8_8_;
                    uStack_510 = local_480._16_8_;
                    uStack_508 = local_480._24_8_;
                    local_500 = local_460._0_8_;
                    uStack_4f8 = local_460._8_8_;
                    uStack_4f0 = local_460._16_8_;
                    uStack_4e8 = local_460._24_8_;
                    *(undefined1 (*) [8])(local_968 + 8) = local_960;
                    *(undefined8 *)(local_968 + 10) = uStack_958;
                    *(undefined8 *)(local_968 + 0xc) = uStack_950;
                    *(undefined8 *)(local_968 + 0xe) = uStack_948;
                    *(undefined1 (*) [8])local_968 = local_960;
                    *(undefined8 *)(local_968 + 2) = uStack_958;
                    *(undefined8 *)(local_968 + 4) = uStack_950;
                    *(undefined8 *)(local_968 + 6) = uStack_948;
                    local_4e0 = pRVar18->instID[0];
                    uStack_4dc = local_4e0;
                    uStack_4d8 = local_4e0;
                    uStack_4d4 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4cc = local_4e0;
                    uStack_4c8 = local_4e0;
                    uStack_4c4 = local_4e0;
                    local_4c0 = pRVar18->instPrimID[0];
                    uStack_4bc = local_4c0;
                    uStack_4b8 = local_4c0;
                    uStack_4b4 = local_4c0;
                    uStack_4b0 = local_4c0;
                    uStack_4ac = local_4c0;
                    uStack_4a8 = local_4c0;
                    uStack_4a4 = local_4c0;
                    *(float *)(ray + k * 4 + 0x100) = fVar257;
                    local_b40 = *local_970;
                    local_b30 = *local_978;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar12->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_5c0;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar12->intersectionFilterN)(&local_ad0);
                      auVar273 = ZEXT3264(local_a60);
                    }
                    auVar235 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar136 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar171._16_16_ = auVar136;
                    auVar171._0_16_ = auVar235;
                    auVar105 = _local_960 & ~auVar171;
                    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0x7f,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar105 >> 0xbf,0) != '\0') ||
                        (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar105[0x1f] < '\0') {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var17)(&local_ad0);
                        auVar273 = ZEXT3264(local_a60);
                      }
                      auVar235 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar136 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar113._16_16_ = auVar136;
                      auVar113._0_16_ = auVar235;
                      auVar105 = _local_960 & ~auVar113;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        auVar114._0_4_ = auVar235._0_4_ ^ local_960._0_4_;
                        auVar114._4_4_ = auVar235._4_4_ ^ local_960._4_4_;
                        auVar114._8_4_ = auVar235._8_4_ ^ (uint)uStack_958;
                        auVar114._12_4_ = auVar235._12_4_ ^ uStack_958._4_4_;
                        auVar114._16_4_ = auVar136._0_4_ ^ (uint)uStack_950;
                        auVar114._20_4_ = auVar136._4_4_ ^ uStack_950._4_4_;
                        auVar114._24_4_ = auVar136._8_4_ ^ (uint)uStack_948;
                        auVar114._28_4_ = auVar136._12_4_ ^ uStack_948._4_4_;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar114,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar105;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar89;
                    break;
                  }
                }
                lVar87 = lVar87 + -1;
                auVar273 = ZEXT3264(local_a60);
              } while (lVar87 != 0);
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar111._4_4_ = uVar9;
              auVar111._0_4_ = uVar9;
              auVar111._8_4_ = uVar9;
              auVar111._12_4_ = uVar9;
              auVar111._16_4_ = uVar9;
              auVar111._20_4_ = uVar9;
              auVar111._24_4_ = uVar9;
              auVar111._28_4_ = uVar9;
              auVar265 = vcmpps_avx(_local_7e0,auVar111,2);
              auVar105 = vandps_avx(auVar265,local_600);
              auVar325 = ZEXT3264(auVar105);
              auVar265 = local_600 & auVar265;
              auVar217 = local_800._0_28_;
              local_600 = auVar105;
            } while ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar265 >> 0x7f,0) != '\0') ||
                       (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar265 >> 0xbf,0) != '\0') ||
                     (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar265[0x1f] < '\0');
            auVar325 = ZEXT3264(local_3a0);
            auVar105 = local_6c0;
          }
          auVar154._0_4_ =
               auVar217._0_4_ * (float)local_840._0_4_ +
               (float)local_820._0_4_ * (float)local_860._0_4_ +
               (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
          auVar154._4_4_ =
               auVar217._4_4_ * (float)local_840._4_4_ +
               (float)local_820._4_4_ * (float)local_860._4_4_ +
               (float)local_7c0._4_4_ * (float)local_6e0._4_4_;
          auVar154._8_4_ =
               auVar217._8_4_ * fStack_838 + fStack_818 * fStack_858 + fStack_7b8 * fStack_6d8;
          auVar154._12_4_ =
               auVar217._12_4_ * fStack_834 + fStack_814 * fStack_854 + fStack_7b4 * fStack_6d4;
          auVar154._16_4_ =
               auVar217._16_4_ * fStack_830 + fStack_810 * fStack_850 + fStack_7b0 * fStack_6d0;
          auVar154._20_4_ =
               auVar217._20_4_ * fStack_82c + fStack_80c * fStack_84c + fStack_7ac * fStack_6cc;
          auVar154._24_4_ =
               auVar217._24_4_ * fStack_828 + fStack_808 * fStack_848 + fStack_7a8 * fStack_6c8;
          auVar154._28_4_ = fStack_804 + fStack_804 + auVar325._28_4_;
          auVar172._8_4_ = 0x7fffffff;
          auVar172._0_8_ = 0x7fffffff7fffffff;
          auVar172._12_4_ = 0x7fffffff;
          auVar172._16_4_ = 0x7fffffff;
          auVar172._20_4_ = 0x7fffffff;
          auVar172._24_4_ = 0x7fffffff;
          auVar172._28_4_ = 0x7fffffff;
          auVar265 = vandps_avx(auVar154,auVar172);
          auVar173._8_4_ = 0x3e99999a;
          auVar173._0_8_ = 0x3e99999a3e99999a;
          auVar173._12_4_ = 0x3e99999a;
          auVar173._16_4_ = 0x3e99999a;
          auVar173._20_4_ = 0x3e99999a;
          auVar173._24_4_ = 0x3e99999a;
          auVar173._28_4_ = 0x3e99999a;
          auVar265 = vcmpps_avx(auVar265,auVar173,1);
          auVar106 = vorps_avx(auVar265,local_660);
          auVar174._0_4_ = (float)local_720._0_4_ + (float)local_8c0;
          auVar174._4_4_ = (float)local_720._4_4_ + local_8c0._4_4_;
          auVar174._8_4_ = fStack_718 + (float)uStack_8b8;
          auVar174._12_4_ = fStack_714 + uStack_8b8._4_4_;
          auVar174._16_4_ = fStack_710 + (float)uStack_8b0;
          auVar174._20_4_ = fStack_70c + uStack_8b0._4_4_;
          auVar174._24_4_ = fStack_708 + (float)uStack_8a8;
          auVar174._28_4_ = fStack_704 + uStack_8a8._4_4_;
          auVar265 = vcmpps_avx(auVar174,auVar111,2);
          _local_860 = vandps_avx(auVar105,auVar265);
          auVar175._8_4_ = 3;
          auVar175._0_8_ = 0x300000003;
          auVar175._12_4_ = 3;
          auVar175._16_4_ = 3;
          auVar175._20_4_ = 3;
          auVar175._24_4_ = 3;
          auVar175._28_4_ = 3;
          auVar198._8_4_ = 2;
          auVar198._0_8_ = 0x200000002;
          auVar198._12_4_ = 2;
          auVar198._16_4_ = 2;
          auVar198._20_4_ = 2;
          auVar198._24_4_ = 2;
          auVar198._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar198,auVar175,auVar106);
          auVar235 = vpcmpgtd_avx(auVar105._16_16_,local_6a0);
          auVar136 = vpshufd_avx(local_680._0_16_,0);
          auVar136 = vpcmpgtd_avx(auVar105._0_16_,auVar136);
          auVar176._16_16_ = auVar235;
          auVar176._0_16_ = auVar111._0_16_;
          _local_840 = vblendps_avx(ZEXT1632(auVar136),auVar176,0xf0);
          auVar105 = vandnps_avx(_local_840,_local_860);
          auVar265 = _local_860 & ~_local_840;
          local_620 = auVar105;
          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar265 >> 0x7f,0) != '\0') ||
                (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar265 >> 0xbf,0) != '\0') ||
              (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar265[0x1f] < '\0') {
            local_7e0._4_4_ = local_8c0._4_4_ + local_3a0._4_4_;
            local_7e0._0_4_ = (float)local_8c0 + local_3a0._0_4_;
            fStack_7d8 = (float)uStack_8b8 + local_3a0._8_4_;
            fStack_7d4 = uStack_8b8._4_4_ + local_3a0._12_4_;
            fStack_7d0 = (float)uStack_8b0 + local_3a0._16_4_;
            fStack_7cc = uStack_8b0._4_4_ + local_3a0._20_4_;
            fStack_7c8 = (float)uStack_8a8 + local_3a0._24_4_;
            fStack_7c4 = uStack_8a8._4_4_ + local_3a0._28_4_;
            _local_a40 = local_3a0;
            do {
              auVar115._8_4_ = 0x7f800000;
              auVar115._0_8_ = 0x7f8000007f800000;
              auVar115._12_4_ = 0x7f800000;
              auVar115._16_4_ = 0x7f800000;
              auVar115._20_4_ = 0x7f800000;
              auVar115._24_4_ = 0x7f800000;
              auVar115._28_4_ = 0x7f800000;
              auVar265 = vblendvps_avx(auVar115,_local_a40,auVar105);
              auVar106 = vshufps_avx(auVar265,auVar265,0xb1);
              auVar106 = vminps_avx(auVar265,auVar106);
              auVar147 = vshufpd_avx(auVar106,auVar106,5);
              auVar106 = vminps_avx(auVar106,auVar147);
              auVar147 = vperm2f128_avx(auVar106,auVar106,1);
              auVar106 = vminps_avx(auVar106,auVar147);
              auVar106 = vcmpps_avx(auVar265,auVar106,0);
              auVar147 = auVar105 & auVar106;
              auVar265 = auVar105;
              if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar147 >> 0x7f,0) != '\0') ||
                    (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar147 >> 0xbf,0) != '\0') ||
                  (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar147[0x1f] < '\0') {
                auVar265 = vandps_avx(auVar106,auVar105);
              }
              uVar78 = vmovmskps_avx(auVar265);
              uVar81 = 0;
              if (uVar78 != 0) {
                for (; (uVar78 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
                }
              }
              uVar80 = (ulong)uVar81;
              local_620 = auVar105;
              *(undefined4 *)(local_620 + uVar80 * 4) = 0;
              fVar257 = local_1c0[uVar80];
              uVar81 = *(uint *)(local_380 + uVar80 * 4);
              fVar89 = auVar30._0_4_;
              if ((float)local_920._0_4_ < 0.0) {
                fVar89 = sqrtf((float)local_920._0_4_);
              }
              auVar136 = vminps_avx(_local_ae0,_local_b00);
              auVar235 = vmaxps_avx(_local_ae0,_local_b00);
              auVar97 = vminps_avx(_local_af0,_local_b10);
              auVar101 = vminps_avx(auVar136,auVar97);
              auVar136 = vmaxps_avx(_local_af0,_local_b10);
              auVar97 = vmaxps_avx(auVar235,auVar136);
              auVar188._8_4_ = 0x7fffffff;
              auVar188._0_8_ = 0x7fffffff7fffffff;
              auVar188._12_4_ = 0x7fffffff;
              auVar235 = vandps_avx(auVar101,auVar188);
              auVar136 = vandps_avx(auVar97,auVar188);
              auVar235 = vmaxps_avx(auVar235,auVar136);
              auVar136 = vmovshdup_avx(auVar235);
              auVar136 = vmaxss_avx(auVar136,auVar235);
              auVar235 = vshufpd_avx(auVar235,auVar235,1);
              auVar235 = vmaxss_avx(auVar235,auVar136);
              local_a80._0_4_ = auVar235._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar89 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
              auVar235 = vinsertps_avx(ZEXT416(uVar81),ZEXT416((uint)fVar257),0x10);
              lVar87 = 5;
              do {
                auVar136 = vmovshdup_avx(auVar235);
                fVar250 = auVar136._0_4_;
                fVar199 = 1.0 - fVar250;
                auVar136 = vshufps_avx(auVar235,auVar235,0x55);
                fVar257 = auVar136._0_4_;
                fVar89 = auVar136._4_4_;
                fVar90 = auVar136._8_4_;
                fVar178 = auVar136._12_4_;
                auVar136 = vshufps_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),0);
                fVar200 = auVar136._0_4_;
                fVar201 = auVar136._4_4_;
                fVar204 = auVar136._8_4_;
                fVar223 = auVar136._12_4_;
                fVar225 = (float)local_af0._0_4_ * fVar257 + (float)local_b00._0_4_ * fVar200;
                fVar227 = (float)local_af0._4_4_ * fVar89 + (float)local_b00._4_4_ * fVar201;
                fVar232 = fStack_ae8 * fVar90 + fStack_af8 * fVar204;
                fVar248 = fStack_ae4 * fVar178 + fStack_af4 * fVar223;
                auVar238._0_4_ =
                     fVar200 * ((float)local_b00._0_4_ * fVar257 + fVar200 * (float)local_ae0._0_4_)
                     + fVar257 * fVar225;
                auVar238._4_4_ =
                     fVar201 * ((float)local_b00._4_4_ * fVar89 + fVar201 * (float)local_ae0._4_4_)
                     + fVar89 * fVar227;
                auVar238._8_4_ =
                     fVar204 * (fStack_af8 * fVar90 + fVar204 * fStack_ad8) + fVar90 * fVar232;
                auVar238._12_4_ =
                     fVar223 * (fStack_af4 * fVar178 + fVar223 * fStack_ad4) + fVar178 * fVar248;
                auVar189._0_4_ =
                     fVar200 * fVar225 +
                     fVar257 * (fVar257 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar200)
                ;
                auVar189._4_4_ =
                     fVar201 * fVar227 +
                     fVar89 * (fVar89 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar201);
                auVar189._8_4_ =
                     fVar204 * fVar232 + fVar90 * (fVar90 * fStack_b08 + fStack_ae8 * fVar204);
                auVar189._12_4_ =
                     fVar223 * fVar248 + fVar178 * (fVar178 * fStack_b04 + fStack_ae4 * fVar223);
                auVar136 = vshufps_avx(auVar235,auVar235,0);
                auVar142._0_4_ = auVar136._0_4_ * (float)local_910._0_4_ + 0.0;
                auVar142._4_4_ = auVar136._4_4_ * (float)local_910._4_4_ + 0.0;
                auVar142._8_4_ = auVar136._8_4_ * fStack_908 + 0.0;
                auVar142._12_4_ = auVar136._12_4_ * fStack_904 + 0.0;
                auVar100._0_4_ = fVar200 * auVar238._0_4_ + fVar257 * auVar189._0_4_;
                auVar100._4_4_ = fVar201 * auVar238._4_4_ + fVar89 * auVar189._4_4_;
                auVar100._8_4_ = fVar204 * auVar238._8_4_ + fVar90 * auVar189._8_4_;
                auVar100._12_4_ = fVar223 * auVar238._12_4_ + fVar178 * auVar189._12_4_;
                local_8a0._0_16_ = auVar100;
                auVar136 = vsubps_avx(auVar142,auVar100);
                _local_aa0 = auVar136;
                auVar136 = vdpps_avx(auVar136,auVar136,0x7f);
                fVar257 = auVar136._0_4_;
                if (fVar257 < 0.0) {
                  fVar89 = sqrtf(fVar257);
                }
                else {
                  auVar97 = vsqrtss_avx(auVar136,auVar136);
                  fVar89 = auVar97._0_4_;
                }
                auVar97 = vsubps_avx(auVar189,auVar238);
                auVar264._0_4_ = auVar97._0_4_ * 3.0;
                auVar264._4_4_ = auVar97._4_4_ * 3.0;
                auVar264._8_4_ = auVar97._8_4_ * 3.0;
                auVar264._12_4_ = auVar97._12_4_ * 3.0;
                auVar97 = vshufps_avx(ZEXT416((uint)(fVar250 * 6.0)),ZEXT416((uint)(fVar250 * 6.0)),
                                      0);
                auVar101 = ZEXT416((uint)((fVar199 - (fVar250 + fVar250)) * 6.0));
                auVar164 = vshufps_avx(auVar101,auVar101,0);
                auVar101 = ZEXT416((uint)((fVar250 - (fVar199 + fVar199)) * 6.0));
                auVar190 = vshufps_avx(auVar101,auVar101,0);
                auVar31 = vshufps_avx(ZEXT416((uint)(fVar199 * 6.0)),ZEXT416((uint)(fVar199 * 6.0)),
                                      0);
                auVar101 = vdpps_avx(auVar264,auVar264,0x7f);
                auVar143._0_4_ =
                     auVar31._0_4_ * (float)local_ae0._0_4_ +
                     auVar190._0_4_ * (float)local_b00._0_4_ +
                     auVar97._0_4_ * (float)local_b10._0_4_ +
                     auVar164._0_4_ * (float)local_af0._0_4_;
                auVar143._4_4_ =
                     auVar31._4_4_ * (float)local_ae0._4_4_ +
                     auVar190._4_4_ * (float)local_b00._4_4_ +
                     auVar97._4_4_ * (float)local_b10._4_4_ +
                     auVar164._4_4_ * (float)local_af0._4_4_;
                auVar143._8_4_ =
                     auVar31._8_4_ * fStack_ad8 +
                     auVar190._8_4_ * fStack_af8 +
                     auVar97._8_4_ * fStack_b08 + auVar164._8_4_ * fStack_ae8;
                auVar143._12_4_ =
                     auVar31._12_4_ * fStack_ad4 +
                     auVar190._12_4_ * fStack_af4 +
                     auVar97._12_4_ * fStack_b04 + auVar164._12_4_ * fStack_ae4;
                auVar97 = vblendps_avx(auVar101,_DAT_01f7aa10,0xe);
                auVar164 = vrsqrtss_avx(auVar97,auVar97);
                fVar178 = auVar164._0_4_;
                fVar90 = auVar101._0_4_;
                auVar164 = vdpps_avx(auVar264,auVar143,0x7f);
                auVar190 = vshufps_avx(auVar101,auVar101,0);
                auVar144._0_4_ = auVar143._0_4_ * auVar190._0_4_;
                auVar144._4_4_ = auVar143._4_4_ * auVar190._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar190._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar190._12_4_;
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar213._0_4_ = auVar264._0_4_ * auVar164._0_4_;
                auVar213._4_4_ = auVar264._4_4_ * auVar164._4_4_;
                auVar213._8_4_ = auVar264._8_4_ * auVar164._8_4_;
                auVar213._12_4_ = auVar264._12_4_ * auVar164._12_4_;
                auVar31 = vsubps_avx(auVar144,auVar213);
                auVar164 = vrcpss_avx(auVar97,auVar97);
                auVar97 = vmaxss_avx(ZEXT416((uint)local_a80._0_4_),
                                     ZEXT416((uint)(auVar235._0_4_ * (float)local_740._0_4_)));
                auVar164 = ZEXT416((uint)(auVar164._0_4_ * (2.0 - fVar90 * auVar164._0_4_)));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                uVar80 = CONCAT44(auVar264._4_4_,auVar264._0_4_);
                auVar317._0_8_ = uVar80 ^ 0x8000000080000000;
                auVar317._8_4_ = -auVar264._8_4_;
                auVar317._12_4_ = -auVar264._12_4_;
                auVar190 = ZEXT416((uint)(fVar178 * 1.5 +
                                         fVar90 * -0.5 * fVar178 * fVar178 * fVar178));
                auVar190 = vshufps_avx(auVar190,auVar190,0);
                auVar191._0_4_ = auVar190._0_4_ * auVar31._0_4_ * auVar164._0_4_;
                auVar191._4_4_ = auVar190._4_4_ * auVar31._4_4_ * auVar164._4_4_;
                auVar191._8_4_ = auVar190._8_4_ * auVar31._8_4_ * auVar164._8_4_;
                auVar191._12_4_ = auVar190._12_4_ * auVar31._12_4_ * auVar164._12_4_;
                local_940._0_4_ = auVar264._0_4_ * auVar190._0_4_;
                local_940._4_4_ = auVar264._4_4_ * auVar190._4_4_;
                local_940._8_4_ = auVar264._8_4_ * auVar190._8_4_;
                local_940._12_4_ = auVar264._12_4_ * auVar190._12_4_;
                if (fVar90 < 0.0) {
                  fVar90 = sqrtf(fVar90);
                }
                else {
                  auVar101 = vsqrtss_avx(auVar101,auVar101);
                  fVar90 = auVar101._0_4_;
                }
                auVar101 = vdpps_avx(_local_aa0,local_940._0_16_,0x7f);
                fVar89 = ((float)local_a80._0_4_ / fVar90) * (fVar89 + 1.0) +
                         fVar89 * (float)local_a80._0_4_ + auVar97._0_4_;
                auVar164 = vdpps_avx(auVar317,local_940._0_16_,0x7f);
                auVar190 = vdpps_avx(_local_aa0,auVar191,0x7f);
                auVar31 = vdpps_avx(_local_910,local_940._0_16_,0x7f);
                auVar32 = vdpps_avx(_local_aa0,auVar317,0x7f);
                fVar90 = auVar164._0_4_ + auVar190._0_4_;
                fVar178 = auVar101._0_4_;
                auVar102._0_4_ = fVar178 * fVar178;
                auVar102._4_4_ = auVar101._4_4_ * auVar101._4_4_;
                auVar102._8_4_ = auVar101._8_4_ * auVar101._8_4_;
                auVar102._12_4_ = auVar101._12_4_ * auVar101._12_4_;
                auVar190 = vsubps_avx(auVar136,auVar102);
                local_940._0_16_ = ZEXT416((uint)fVar90);
                auVar164 = vdpps_avx(_local_aa0,_local_910,0x7f);
                fVar199 = auVar32._0_4_ - fVar178 * fVar90;
                fVar178 = auVar164._0_4_ - fVar178 * auVar31._0_4_;
                auVar164 = vrsqrtss_avx(auVar190,auVar190);
                fVar200 = auVar190._0_4_;
                fVar90 = auVar164._0_4_;
                fVar90 = fVar90 * 1.5 + fVar200 * -0.5 * fVar90 * fVar90 * fVar90;
                if (fVar200 < 0.0) {
                  local_900._0_4_ = fVar199;
                  local_760._0_4_ = fVar178;
                  local_780._0_4_ = fVar90;
                  fVar200 = sqrtf(fVar200);
                  fVar90 = (float)local_780._0_4_;
                  fVar199 = (float)local_900._0_4_;
                  fVar178 = (float)local_760._0_4_;
                }
                else {
                  auVar164 = vsqrtss_avx(auVar190,auVar190);
                  fVar200 = auVar164._0_4_;
                }
                auVar32 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar99 = vshufps_avx(auVar264,auVar264,0xff);
                fVar199 = fVar199 * fVar90 - auVar99._0_4_;
                auVar214._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
                auVar214._8_4_ = auVar31._8_4_ ^ 0x80000000;
                auVar214._12_4_ = auVar31._12_4_ ^ 0x80000000;
                auVar239._0_4_ = -fVar199;
                auVar239._4_4_ = 0x80000000;
                auVar239._8_4_ = 0x80000000;
                auVar239._12_4_ = 0x80000000;
                auVar164 = vinsertps_avx(auVar239,ZEXT416((uint)(fVar178 * fVar90)),0x1c);
                auVar31 = vmovsldup_avx(ZEXT416((uint)(local_940._0_4_ * fVar178 * fVar90 -
                                                      auVar31._0_4_ * fVar199)));
                auVar164 = vdivps_avx(auVar164,auVar31);
                auVar190 = vinsertps_avx(local_940._0_16_,auVar214,0x10);
                auVar190 = vdivps_avx(auVar190,auVar31);
                auVar31 = vmovsldup_avx(auVar101);
                auVar103 = ZEXT416((uint)(fVar200 - auVar32._0_4_));
                auVar32 = vmovsldup_avx(auVar103);
                auVar165._0_4_ = auVar31._0_4_ * auVar164._0_4_ + auVar32._0_4_ * auVar190._0_4_;
                auVar165._4_4_ = auVar31._4_4_ * auVar164._4_4_ + auVar32._4_4_ * auVar190._4_4_;
                auVar165._8_4_ = auVar31._8_4_ * auVar164._8_4_ + auVar32._8_4_ * auVar190._8_4_;
                auVar165._12_4_ =
                     auVar31._12_4_ * auVar164._12_4_ + auVar32._12_4_ * auVar190._12_4_;
                auVar235 = vsubps_avx(auVar235,auVar165);
                auVar166._8_4_ = 0x7fffffff;
                auVar166._0_8_ = 0x7fffffff7fffffff;
                auVar166._12_4_ = 0x7fffffff;
                auVar101 = vandps_avx(auVar101,auVar166);
                if (auVar101._0_4_ < fVar89) {
                  auVar192._8_4_ = 0x7fffffff;
                  auVar192._0_8_ = 0x7fffffff7fffffff;
                  auVar192._12_4_ = 0x7fffffff;
                  auVar101 = vandps_avx(auVar103,auVar192);
                  if (auVar101._0_4_ <
                      (float)local_7a0._0_4_ * 1.9073486e-06 + fVar89 + auVar97._0_4_) {
                    fVar89 = auVar235._0_4_ + (float)local_880._0_4_;
                    auVar273 = ZEXT3264(local_a60);
                    if ((fVar89 < fVar129) ||
                       (fVar90 = *(float *)(ray + k * 4 + 0x100), fVar90 < fVar89)) break;
                    auVar97 = vmovshdup_avx(auVar235);
                    fVar178 = auVar97._0_4_;
                    if ((fVar178 < 0.0) || (1.0 < fVar178)) break;
                    auVar136 = vrsqrtss_avx(auVar136,auVar136);
                    fVar199 = auVar136._0_4_;
                    pGVar12 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar136 = ZEXT416((uint)(fVar199 * 1.5 +
                                             fVar257 * -0.5 * fVar199 * fVar199 * fVar199));
                    auVar136 = vshufps_avx(auVar136,auVar136,0);
                    auVar193._0_4_ = auVar136._0_4_ * (float)local_aa0._0_4_;
                    auVar193._4_4_ = auVar136._4_4_ * (float)local_aa0._4_4_;
                    auVar193._8_4_ = auVar136._8_4_ * fStack_a98;
                    auVar193._12_4_ = auVar136._12_4_ * fStack_a94;
                    auVar145._0_4_ = auVar264._0_4_ + auVar99._0_4_ * auVar193._0_4_;
                    auVar145._4_4_ = auVar264._4_4_ + auVar99._4_4_ * auVar193._4_4_;
                    auVar145._8_4_ = auVar264._8_4_ + auVar99._8_4_ * auVar193._8_4_;
                    auVar145._12_4_ = auVar264._12_4_ + auVar99._12_4_ * auVar193._12_4_;
                    auVar136 = vshufps_avx(auVar193,auVar193,0xc9);
                    auVar97 = vshufps_avx(auVar264,auVar264,0xc9);
                    auVar194._0_4_ = auVar97._0_4_ * auVar193._0_4_;
                    auVar194._4_4_ = auVar97._4_4_ * auVar193._4_4_;
                    auVar194._8_4_ = auVar97._8_4_ * auVar193._8_4_;
                    auVar194._12_4_ = auVar97._12_4_ * auVar193._12_4_;
                    auVar215._0_4_ = auVar264._0_4_ * auVar136._0_4_;
                    auVar215._4_4_ = auVar264._4_4_ * auVar136._4_4_;
                    auVar215._8_4_ = auVar264._8_4_ * auVar136._8_4_;
                    auVar215._12_4_ = auVar264._12_4_ * auVar136._12_4_;
                    auVar101 = vsubps_avx(auVar215,auVar194);
                    auVar136 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar97 = vshufps_avx(auVar145,auVar145,0xc9);
                    auVar216._0_4_ = auVar97._0_4_ * auVar136._0_4_;
                    auVar216._4_4_ = auVar97._4_4_ * auVar136._4_4_;
                    auVar216._8_4_ = auVar97._8_4_ * auVar136._8_4_;
                    auVar216._12_4_ = auVar97._12_4_ * auVar136._12_4_;
                    auVar136 = vshufps_avx(auVar101,auVar101,0xd2);
                    auVar146._0_4_ = auVar145._0_4_ * auVar136._0_4_;
                    auVar146._4_4_ = auVar145._4_4_ * auVar136._4_4_;
                    auVar146._8_4_ = auVar145._8_4_ * auVar136._8_4_;
                    auVar146._12_4_ = auVar145._12_4_ * auVar136._12_4_;
                    auVar136 = vsubps_avx(auVar216,auVar146);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar89;
                      uVar9 = vextractps_avx(auVar136,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar136,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar136._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar178;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_8e0;
                      *(uint *)(ray + k * 4 + 0x240) = uVar83;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar18 = context->user;
                    auStack_550 = vshufps_avx(auVar235,auVar235,0x55);
                    auStack_5b0 = vshufps_avx(auVar136,auVar136,0x55);
                    auStack_590 = vshufps_avx(auVar136,auVar136,0xaa);
                    auStack_570 = vshufps_avx(auVar136,auVar136,0);
                    local_5c0 = (RTCHitN  [16])auStack_5b0;
                    local_5a0 = auStack_590;
                    local_580 = auStack_570;
                    local_560 = auStack_550;
                    local_540 = ZEXT832(0) << 0x20;
                    local_520 = local_480._0_8_;
                    uStack_518 = local_480._8_8_;
                    uStack_510 = local_480._16_8_;
                    uStack_508 = local_480._24_8_;
                    local_500 = local_460._0_8_;
                    uStack_4f8 = local_460._8_8_;
                    uStack_4f0 = local_460._16_8_;
                    uStack_4e8 = local_460._24_8_;
                    *(undefined1 (*) [8])(local_968 + 8) = local_960;
                    *(undefined8 *)(local_968 + 10) = uStack_958;
                    *(undefined8 *)(local_968 + 0xc) = uStack_950;
                    *(undefined8 *)(local_968 + 0xe) = uStack_948;
                    *(undefined1 (*) [8])local_968 = local_960;
                    *(undefined8 *)(local_968 + 2) = uStack_958;
                    *(undefined8 *)(local_968 + 4) = uStack_950;
                    *(undefined8 *)(local_968 + 6) = uStack_948;
                    local_4e0 = pRVar18->instID[0];
                    uStack_4dc = local_4e0;
                    uStack_4d8 = local_4e0;
                    uStack_4d4 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4cc = local_4e0;
                    uStack_4c8 = local_4e0;
                    uStack_4c4 = local_4e0;
                    local_4c0 = pRVar18->instPrimID[0];
                    uStack_4bc = local_4c0;
                    uStack_4b8 = local_4c0;
                    uStack_4b4 = local_4c0;
                    uStack_4b0 = local_4c0;
                    uStack_4ac = local_4c0;
                    uStack_4a8 = local_4c0;
                    uStack_4a4 = local_4c0;
                    *(float *)(ray + k * 4 + 0x100) = fVar89;
                    local_b40 = *local_970;
                    local_b30 = *local_978;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar12->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_5c0;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar12->intersectionFilterN)(&local_ad0);
                      auVar273 = ZEXT3264(local_a60);
                    }
                    auVar235 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar136 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar177._16_16_ = auVar136;
                    auVar177._0_16_ = auVar235;
                    auVar105 = _local_960 & ~auVar177;
                    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0x7f,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar105 >> 0xbf,0) != '\0') ||
                        (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar105[0x1f] < '\0') {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var17)(&local_ad0);
                        auVar273 = ZEXT3264(local_a60);
                      }
                      auVar235 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar136 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar116._16_16_ = auVar136;
                      auVar116._0_16_ = auVar235;
                      auVar105 = _local_960 & ~auVar116;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        auVar117._0_4_ = auVar235._0_4_ ^ local_960._0_4_;
                        auVar117._4_4_ = auVar235._4_4_ ^ local_960._4_4_;
                        auVar117._8_4_ = auVar235._8_4_ ^ (uint)uStack_958;
                        auVar117._12_4_ = auVar235._12_4_ ^ uStack_958._4_4_;
                        auVar117._16_4_ = auVar136._0_4_ ^ (uint)uStack_950;
                        auVar117._20_4_ = auVar136._4_4_ ^ uStack_950._4_4_;
                        auVar117._24_4_ = auVar136._8_4_ ^ (uint)uStack_948;
                        auVar117._28_4_ = auVar136._12_4_ ^ uStack_948._4_4_;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar105;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar90;
                    break;
                  }
                }
                lVar87 = lVar87 + -1;
                auVar273 = ZEXT3264(local_a60);
              } while (lVar87 != 0);
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar111._4_4_ = uVar9;
              auVar111._0_4_ = uVar9;
              auVar111._8_4_ = uVar9;
              auVar111._12_4_ = uVar9;
              auVar111._16_4_ = uVar9;
              auVar111._20_4_ = uVar9;
              auVar111._24_4_ = uVar9;
              auVar111._28_4_ = uVar9;
              auVar265 = vcmpps_avx(_local_7e0,auVar111,2);
              auVar105 = vandps_avx(auVar265,local_620);
              auVar265 = local_620 & auVar265;
              local_620 = auVar105;
            } while ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar265 >> 0x7f,0) != '\0') ||
                       (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar265 >> 0xbf,0) != '\0') ||
                     (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar265[0x1f] < '\0');
          }
          auVar396 = ZEXT3264(local_a00);
          auVar367 = ZEXT3264(local_9e0);
          auVar355 = ZEXT3264(local_9c0);
          auVar325 = ZEXT3264(local_9a0);
          auVar400 = ZEXT3264(local_a20);
          auVar105 = vandps_avx(local_700,local_640);
          auVar265 = vandps_avx(_local_860,_local_840);
          auVar221._0_4_ = (float)local_8c0 + local_3e0._0_4_;
          auVar221._4_4_ = local_8c0._4_4_ + local_3e0._4_4_;
          auVar221._8_4_ = (float)uStack_8b8 + local_3e0._8_4_;
          auVar221._12_4_ = uStack_8b8._4_4_ + local_3e0._12_4_;
          auVar221._16_4_ = (float)uStack_8b0 + local_3e0._16_4_;
          auVar221._20_4_ = uStack_8b0._4_4_ + local_3e0._20_4_;
          auVar221._24_4_ = (float)uStack_8a8 + local_3e0._24_4_;
          auVar221._28_4_ = uStack_8a8._4_4_ + local_3e0._28_4_;
          auVar106 = vcmpps_avx(auVar221,auVar111,2);
          auVar105 = vandps_avx(auVar106,auVar105);
          auVar222._0_4_ = (float)local_8c0 + local_3a0._0_4_;
          auVar222._4_4_ = local_8c0._4_4_ + local_3a0._4_4_;
          auVar222._8_4_ = (float)uStack_8b8 + local_3a0._8_4_;
          auVar222._12_4_ = uStack_8b8._4_4_ + local_3a0._12_4_;
          auVar222._16_4_ = (float)uStack_8b0 + local_3a0._16_4_;
          auVar222._20_4_ = uStack_8b0._4_4_ + local_3a0._20_4_;
          auVar222._24_4_ = (float)uStack_8a8 + local_3a0._24_4_;
          auVar222._28_4_ = uStack_8a8._4_4_ + local_3a0._28_4_;
          auVar106 = vcmpps_avx(auVar222,auVar111,2);
          auVar265 = vandps_avx(auVar106,auVar265);
          auVar265 = vorps_avx(auVar105,auVar265);
          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar265 >> 0x7f,0) != '\0') ||
                (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar265 >> 0xbf,0) != '\0') ||
              (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar265[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar86 * 0x60) = auVar265;
            auVar105 = vblendvps_avx(local_3a0,_local_3e0,auVar105);
            *(undefined1 (*) [32])(auStack_160 + uVar86 * 0x60) = auVar105;
            uVar10 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar86 * 0xc] = uVar10;
            aiStack_138[uVar86 * 0x18] = local_c88 + 1;
            iVar85 = iVar85 + 1;
          }
          goto LAB_00f6c70c;
        }
      }
      auVar396 = ZEXT3264(local_a00);
      auVar367 = ZEXT3264(local_9e0);
      auVar355 = ZEXT3264(local_9c0);
      auVar325 = ZEXT3264(local_9a0);
      auVar400 = ZEXT3264(local_a20);
      auVar273 = ZEXT3264(local_a60);
    }
LAB_00f6c70c:
    auVar265 = local_420;
    if (iVar85 == 0) break;
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar108._4_4_ = uVar9;
    auVar108._0_4_ = uVar9;
    auVar108._8_4_ = uVar9;
    auVar108._12_4_ = uVar9;
    auVar108._16_4_ = uVar9;
    auVar108._20_4_ = uVar9;
    auVar108._24_4_ = uVar9;
    auVar108._28_4_ = uVar9;
    uVar81 = -iVar85;
    pauVar79 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar85 - 1) * 0x60);
    while( true ) {
      auVar105 = pauVar79[1];
      auVar149._0_4_ = (float)local_8c0 + auVar105._0_4_;
      auVar149._4_4_ = local_8c0._4_4_ + auVar105._4_4_;
      auVar149._8_4_ = (float)uStack_8b8 + auVar105._8_4_;
      auVar149._12_4_ = uStack_8b8._4_4_ + auVar105._12_4_;
      auVar149._16_4_ = (float)uStack_8b0 + auVar105._16_4_;
      auVar149._20_4_ = uStack_8b0._4_4_ + auVar105._20_4_;
      auVar149._24_4_ = (float)uStack_8a8 + auVar105._24_4_;
      auVar149._28_4_ = uStack_8a8._4_4_ + auVar105._28_4_;
      auVar147 = vcmpps_avx(auVar149,auVar108,2);
      auVar106 = vandps_avx(auVar147,*pauVar79);
      _local_5c0 = auVar106;
      auVar147 = *pauVar79 & auVar147;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0x7f,0) != '\0') ||
            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar147 >> 0xbf,0) != '\0') ||
          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar147[0x1f] < '\0') break;
      pauVar79 = pauVar79 + -3;
      uVar81 = uVar81 + 1;
      if (uVar81 == 0) goto LAB_00f6e375;
    }
    auVar109._8_4_ = 0x7f800000;
    auVar109._0_8_ = 0x7f8000007f800000;
    auVar109._12_4_ = 0x7f800000;
    auVar109._16_4_ = 0x7f800000;
    auVar109._20_4_ = 0x7f800000;
    auVar109._24_4_ = 0x7f800000;
    auVar109._28_4_ = 0x7f800000;
    auVar105 = vblendvps_avx(auVar109,auVar105,auVar106);
    auVar147 = vshufps_avx(auVar105,auVar105,0xb1);
    auVar147 = vminps_avx(auVar105,auVar147);
    auVar168 = vshufpd_avx(auVar147,auVar147,5);
    auVar147 = vminps_avx(auVar147,auVar168);
    auVar168 = vperm2f128_avx(auVar147,auVar147,1);
    auVar147 = vminps_avx(auVar147,auVar168);
    auVar105 = vcmpps_avx(auVar105,auVar147,0);
    auVar147 = auVar106 & auVar105;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar147 >> 0x7f,0) != '\0') ||
          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar147 >> 0xbf,0) != '\0') ||
        (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar147[0x1f] < '\0') {
      auVar106 = vandps_avx(auVar105,auVar106);
    }
    auVar95._8_8_ = 0;
    auVar95._0_8_ = *(ulong *)pauVar79[2];
    local_c88 = *(uint *)(pauVar79[2] + 8);
    uVar82 = vmovmskps_avx(auVar106);
    uVar78 = 0;
    if (uVar82 != 0) {
      for (; (uVar82 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
      }
    }
    *(undefined4 *)(local_5c0 + (ulong)uVar78 * 4) = 0;
    *pauVar79 = _local_5c0;
    uVar82 = ~uVar81;
    if ((((((((_local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_5c0 >> 0x7f,0) != '\0') ||
          (_local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_5c0 >> 0xbf,0) != '\0') ||
        (_local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5c0[0x1f] < '\0') {
      uVar82 = -uVar81;
    }
    uVar86 = (ulong)uVar82;
    auVar235 = vshufps_avx(auVar95,auVar95,0);
    auVar136 = vshufps_avx(auVar95,auVar95,0x55);
    auVar136 = vsubps_avx(auVar136,auVar235);
    local_3e0._4_4_ = auVar235._4_4_ + auVar136._4_4_ * 0.14285715;
    local_3e0._0_4_ = auVar235._0_4_ + auVar136._0_4_ * 0.0;
    fStack_3d8 = auVar235._8_4_ + auVar136._8_4_ * 0.2857143;
    fStack_3d4 = auVar235._12_4_ + auVar136._12_4_ * 0.42857146;
    fStack_3d0 = auVar235._0_4_ + auVar136._0_4_ * 0.5714286;
    fStack_3cc = auVar235._4_4_ + auVar136._4_4_ * 0.71428573;
    fStack_3c8 = auVar235._8_4_ + auVar136._8_4_ * 0.8571429;
    fStack_3c4 = auVar235._12_4_ + auVar136._12_4_;
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar78 * 4);
  } while( true );
LAB_00f6e375:
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar104._4_4_ = uVar9;
  auVar104._0_4_ = uVar9;
  auVar104._8_4_ = uVar9;
  auVar104._12_4_ = uVar9;
  auVar135 = vcmpps_avx(local_5e0,auVar104,2);
  uVar83 = vmovmskps_avx(auVar135);
  uVar77 = uVar77 - 1 & uVar77 & uVar83;
  if (uVar77 == 0) {
    return;
  }
  goto LAB_00f6b522;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }